

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeInternalJacobianContIntDamping
          (ChElementHexaANCF_3843 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  element_type *peVar47;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  MatrixNx6 *pMVar48;
  double dVar49;
  undefined1 auVar50 [16];
  long lVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  Index outer;
  long lVar62;
  int i;
  long lVar63;
  undefined1 (*pauVar64) [64];
  char *pcVar65;
  long lVar66;
  ulong uVar67;
  Index col_1;
  double *pdVar68;
  PointerType pdVar69;
  undefined1 (*pauVar70) [64];
  long lVar71;
  Index row;
  long lVar72;
  MatrixNx6 *pMVar73;
  undefined1 (*pauVar74) [64];
  Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> TVar75;
  undefined1 (*pauVar76) [64];
  Matrix<double,__1,__1,_1,__1,__1> *pMVar77;
  ulong uVar78;
  double *pdVar79;
  double *pdVar80;
  double *pdVar81;
  Scalar *alpha;
  ChMatrixRef *pCVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined8 in_XMM0_Qb;
  undefined1 auVar96 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar97 [16];
  Matrix<double,__1,__1,_1,__1,__1> Scaled_Combined_PE;
  Matrix<double,__1,__1,_1,__1,__1> DScaled_Combined_PE;
  Matrix<double,__1,__1,_1,__1,__1> PE;
  VectorNIP E_BlockDamping;
  VectorNIP E1_Block;
  VectorNIP E2_Block;
  VectorNIP E3_Block;
  VectorNIP E6_Block;
  VectorNIP E5_Block;
  VectorNIP E4_Block;
  ChMatrixNMc<double,_3_*_NIP,_6> FC;
  ChMatrixNMc<double,_3_*_NIP,_3> FCscaled;
  VectorNIP SPK2_6_Block;
  VectorNIP SPK2_5_Block;
  VectorNIP SPK2_4_Block;
  VectorNIP SPK2_3_Block;
  VectorNIP SPK2_2_Block;
  VectorNIP SPK2_1_Block;
  ChVectorN<double,_(NSF_*_(NSF___1))___2> ScaledMassMatrix;
  ChMatrixNM<double,_NSF,_3_*_NIP> S_scaled_SD;
  MatrixNx6 ebar_ebardot;
  DenseStorage<double,__1,__1,__1,_1> DStack_12c30;
  DenseStorage<double,__1,__1,__1,_1> DStack_12c10;
  ChMatrixRef *pCStack_12bf8;
  DenseStorage<double,__1,__1,__1,_1> DStack_12bf0;
  double dStack_12bd0;
  undefined8 uStack_12bc8;
  undefined1 auStack_12bc0 [16];
  undefined1 *puStack_12bb0;
  DstXprType *pDStack_12ba8;
  undefined1 auStack_12ba0 [32];
  undefined1 auStack_12b80 [64];
  undefined1 auStack_12b40 [64];
  undefined1 auStack_12b00 [64];
  undefined1 auStack_12ac0 [64];
  undefined1 auStack_12a80 [64];
  undefined1 auStack_12a40 [64];
  undefined1 auStack_12a00 [64];
  undefined1 auStack_129c0 [64];
  undefined1 auStack_12980 [64];
  undefined1 auStack_12940 [64];
  undefined1 auStack_12900 [64];
  undefined1 auStack_128c0 [64];
  undefined1 auStack_12880 [64];
  undefined1 auStack_12840 [64];
  undefined1 auStack_12800 [64];
  undefined1 auStack_127c0 [64];
  undefined1 auStack_12780 [64];
  undefined1 auStack_12740 [64];
  undefined1 auStack_12700 [64];
  undefined1 auStack_126c0 [64];
  undefined1 auStack_12680 [64];
  undefined1 auStack_12640 [64];
  undefined1 auStack_12600 [64];
  double dStack_125a0;
  undefined1 *puStack_12590;
  undefined1 auStack_12588 [8];
  undefined1 auStack_12580 [64];
  undefined1 auStack_12540 [64];
  undefined1 auStack_12500 [64];
  undefined1 auStack_124c0 [64];
  undefined1 auStack_12480 [64];
  undefined1 auStack_12440 [64];
  undefined1 auStack_12400 [64];
  undefined1 auStack_123c0 [64];
  double dStack_12380;
  undefined8 uStack_12378;
  undefined8 uStack_12370;
  undefined8 uStack_12368;
  undefined8 uStack_12360;
  undefined8 uStack_12358;
  undefined8 uStack_12350;
  undefined8 uStack_12348;
  undefined1 auStack_12340 [64];
  undefined1 auStack_12300 [64];
  undefined1 auStack_122c0 [64];
  undefined1 auStack_12280 [64];
  undefined1 auStack_12240 [64];
  undefined1 auStack_12200 [64];
  undefined1 auStack_121c0 [64];
  undefined1 auStack_12180 [64];
  undefined1 auStack_12140 [64];
  undefined1 auStack_12100 [64];
  undefined1 auStack_120c0 [64];
  undefined1 auStack_12080 [64];
  undefined1 auStack_12040 [64];
  undefined1 auStack_12000 [64];
  undefined1 auStack_11fc0 [64];
  undefined1 auStack_11f80 [64];
  undefined1 auStack_11f40 [64];
  undefined1 auStack_11f00 [64];
  undefined1 auStack_11ec0 [64];
  undefined1 auStack_11e80 [64];
  undefined1 auStack_11e40 [64];
  undefined1 auStack_11e00 [64];
  undefined1 auStack_11dc0 [64];
  undefined1 auStack_11d80 [64];
  long lStack_11d40;
  undefined8 uStack_11d38;
  undefined8 uStack_11d30;
  undefined8 uStack_11d28;
  undefined8 uStack_11d20;
  undefined8 uStack_11d18;
  undefined8 uStack_11d10;
  undefined8 uStack_11d08;
  long lStack_11d00;
  undefined8 uStack_11cf8;
  undefined8 uStack_11cf0;
  undefined8 uStack_11ce8;
  undefined8 uStack_11ce0;
  undefined8 uStack_11cd8;
  undefined8 uStack_11cd0;
  undefined8 uStack_11cc8;
  undefined1 auStack_11cc0 [64];
  undefined1 auStack_11c80 [64];
  undefined1 auStack_11c40 [64];
  undefined1 auStack_11c00 [64];
  undefined1 auStack_11bc0 [64];
  undefined1 auStack_11b80 [64];
  undefined1 auStack_11b40 [64];
  undefined1 auStack_11b00 [64];
  undefined1 auStack_11ac0 [64];
  undefined1 auStack_11a80 [64];
  undefined1 auStack_11a40 [64];
  undefined1 auStack_11a00 [64];
  undefined1 auStack_119c0 [64];
  undefined1 auStack_11980 [64];
  undefined1 auStack_11940 [64];
  undefined1 auStack_11900 [64];
  undefined1 auStack_118c0 [64];
  undefined1 auStack_11880 [64];
  undefined1 auStack_11840 [64];
  undefined1 auStack_11800 [64];
  undefined1 auStack_117c0 [64];
  undefined1 auStack_11780 [64];
  undefined1 auStack_11740 [64];
  undefined1 auStack_11700 [64];
  undefined1 auStack_116c0 [64];
  undefined1 auStack_11680 [64];
  undefined1 auStack_11640 [64];
  undefined1 auStack_11600 [64];
  undefined1 auStack_115c0 [64];
  undefined1 auStack_11580 [64];
  undefined1 auStack_11540 [64];
  undefined1 auStack_11500 [64];
  undefined1 auStack_114c0 [64];
  undefined1 auStack_11480 [64];
  undefined1 auStack_11440 [64];
  undefined1 auStack_11400 [64];
  undefined1 auStack_113c0 [64];
  undefined1 auStack_11380 [64];
  undefined1 auStack_11340 [64];
  undefined1 auStack_11300 [64];
  undefined1 auStack_112c0 [64];
  undefined1 auStack_11280 [64];
  undefined1 auStack_11240 [64];
  undefined1 auStack_11200 [64];
  undefined1 auStack_111c0 [64];
  undefined1 auStack_11180 [64];
  undefined1 auStack_11140 [64];
  undefined1 auStack_11100 [64];
  undefined1 auStack_110c0 [64];
  undefined1 auStack_11080 [64];
  undefined1 auStack_11040 [64];
  undefined1 auStack_11000 [64];
  undefined1 auStack_10fc0 [64];
  undefined1 auStack_10f80 [64];
  undefined1 auStack_10f40 [64];
  undefined1 auStack_10f00 [64];
  undefined1 auStack_10ec0 [64];
  undefined1 auStack_10e80 [64];
  undefined1 auStack_10e40 [64];
  undefined1 auStack_10e00 [64];
  undefined1 auStack_10dc0 [64];
  undefined1 auStack_10d80 [64];
  undefined1 auStack_10d40 [64];
  undefined1 auStack_10d00 [64];
  undefined1 auStack_10cc0 [64];
  undefined1 auStack_10c80 [64];
  undefined1 auStack_10c40 [64];
  undefined1 auStack_10c00 [64];
  undefined1 auStack_10bc0 [64];
  undefined1 auStack_10b80 [64];
  undefined1 auStack_10b40 [64];
  undefined1 auStack_10b00 [64];
  undefined1 auStack_10ac0 [64];
  undefined1 auStack_10a80 [64];
  undefined1 auStack_10a40 [64];
  undefined1 auStack_10a00 [64];
  undefined1 auStack_109c0 [64];
  undefined1 auStack_10980 [64];
  undefined1 auStack_10940 [64];
  undefined1 auStack_10900 [64];
  undefined1 auStack_108c0 [64];
  undefined1 auStack_10880 [64];
  undefined1 auStack_10840 [64];
  undefined1 auStack_10800 [64];
  undefined1 auStack_107c0 [64];
  undefined1 auStack_10780 [64];
  undefined1 auStack_10740 [64];
  undefined1 auStack_10700 [64];
  undefined1 auStack_106c0 [64];
  undefined1 auStack_10680 [64];
  undefined1 auStack_10640 [64];
  undefined1 auStack_10600 [64];
  undefined1 auStack_105c0 [64];
  undefined1 auStack_10580 [64];
  undefined1 auStack_10540 [64];
  undefined1 auStack_10500 [64];
  undefined1 auStack_104c0 [64];
  undefined1 auStack_10480 [64];
  undefined1 auStack_10440 [64];
  undefined1 auStack_10400 [64];
  undefined1 auStack_103c0 [64];
  undefined1 auStack_10380 [64];
  undefined1 auStack_10340 [64];
  undefined1 auStack_10300 [64];
  undefined1 auStack_102c0 [64];
  undefined1 auStack_10280 [64];
  undefined1 auStack_10240 [64];
  undefined1 auStack_10200 [64];
  undefined1 auStack_101c0 [64];
  undefined1 auStack_10180 [64];
  undefined1 auStack_10140 [64];
  undefined1 auStack_10100 [64];
  undefined1 auStack_100c0 [64];
  undefined1 auStack_10080 [64];
  undefined1 auStack_10040 [64];
  undefined1 local_10000 [64];
  undefined1 local_ffc0 [64];
  undefined1 local_ff80 [64];
  undefined1 local_ff40 [64];
  undefined1 local_ff00 [64];
  undefined1 local_fec0 [64];
  undefined1 local_fe80 [64];
  undefined1 local_fe40 [64];
  undefined1 local_fe00 [64];
  undefined1 local_fdc0 [64];
  undefined1 local_fd80 [64];
  undefined1 local_fd40 [64];
  undefined1 local_fd00 [64];
  undefined1 local_fcc0 [64];
  undefined1 local_fc80 [64];
  undefined1 local_fc40 [64];
  undefined1 local_fc00 [64];
  undefined1 local_fbc0 [64];
  undefined1 local_fb80 [64];
  undefined1 local_fb40 [64];
  undefined1 local_fb00 [64];
  undefined1 local_fac0 [64];
  undefined1 local_fa80 [64];
  undefined1 local_fa40 [64];
  undefined1 local_fa00 [64];
  undefined1 local_f9c0 [64];
  undefined1 local_f980 [64];
  undefined1 local_f940 [64];
  undefined1 local_f900 [64];
  long local_f8c0;
  undefined8 uStack_f8b8;
  undefined8 uStack_f8b0;
  undefined8 uStack_f8a8;
  undefined8 uStack_f8a0;
  undefined8 uStack_f898;
  undefined8 uStack_f890;
  undefined8 uStack_f888;
  long local_f880;
  undefined8 uStack_f878;
  undefined8 uStack_f870;
  undefined8 uStack_f868;
  undefined8 uStack_f860;
  undefined8 uStack_f858;
  undefined8 uStack_f850;
  undefined8 uStack_f848;
  double *local_f840;
  undefined8 uStack_f838;
  undefined8 uStack_f830;
  undefined8 uStack_f828;
  undefined8 uStack_f820;
  undefined8 uStack_f818;
  undefined8 uStack_f810;
  undefined8 uStack_f808;
  long local_f800;
  undefined8 uStack_f7f8;
  undefined8 uStack_f7f0;
  undefined8 uStack_f7e8;
  undefined8 uStack_f7e0;
  undefined8 uStack_f7d8;
  undefined8 uStack_f7d0;
  undefined8 uStack_f7c8;
  ChElementHexaANCF_3843 *local_f7c0;
  undefined8 uStack_f7b8;
  undefined8 uStack_f7b0;
  undefined8 uStack_f7a8;
  undefined8 uStack_f7a0;
  undefined8 uStack_f798;
  undefined8 uStack_f790;
  undefined8 uStack_f788;
  ulong local_f780;
  undefined8 uStack_f778;
  undefined8 uStack_f770;
  undefined8 uStack_f768;
  undefined8 uStack_f760;
  undefined8 uStack_f758;
  undefined8 uStack_f750;
  undefined8 uStack_f748;
  PointerType local_f740;
  undefined8 uStack_f738;
  undefined8 uStack_f730;
  undefined8 uStack_f728;
  undefined8 uStack_f720;
  undefined8 uStack_f718;
  undefined8 uStack_f710;
  undefined8 uStack_f708;
  PointerType local_f700;
  undefined8 uStack_f6f8;
  undefined8 uStack_f6f0;
  undefined8 uStack_f6e8;
  undefined8 uStack_f6e0;
  undefined8 uStack_f6d8;
  undefined8 uStack_f6d0;
  undefined8 uStack_f6c8;
  PointerType local_f6c0;
  undefined8 uStack_f6b8;
  undefined8 uStack_f6b0;
  undefined8 uStack_f6a8;
  undefined8 uStack_f6a0;
  undefined8 uStack_f698;
  undefined8 uStack_f690;
  undefined8 uStack_f688;
  ulong local_f680;
  undefined8 uStack_f678;
  undefined8 uStack_f670;
  undefined8 uStack_f668;
  undefined8 uStack_f660;
  undefined8 uStack_f658;
  undefined8 uStack_f650;
  undefined8 uStack_f648;
  long local_f640;
  undefined8 uStack_f638;
  undefined8 uStack_f630;
  undefined8 uStack_f628;
  undefined8 uStack_f620;
  undefined8 uStack_f618;
  undefined8 uStack_f610;
  undefined8 uStack_f608;
  Scalar local_f600;
  undefined1 auStack_f5f8 [56];
  undefined1 local_f5c0 [64];
  undefined1 local_f580 [64];
  undefined1 local_f540 [64];
  undefined1 local_f500 [64];
  undefined1 local_f4c0 [64];
  undefined1 local_f480 [64];
  undefined1 local_f440 [64];
  undefined1 local_f400 [64];
  undefined1 local_f3c0 [64];
  undefined1 local_f380 [64];
  undefined1 local_f340 [64];
  undefined1 local_f300 [64];
  undefined1 local_f2c0 [64];
  undefined1 local_f280 [64];
  undefined1 local_f240 [64];
  undefined1 local_f200 [64];
  undefined1 local_f1c0 [64];
  undefined1 local_f180 [64];
  undefined1 local_f140 [64];
  undefined1 local_f100 [64];
  undefined1 local_f0c0 [64];
  undefined1 local_f080 [64];
  undefined1 local_f040 [64];
  undefined1 local_f000 [64];
  undefined1 local_efc0 [64];
  undefined1 local_ef80 [64];
  undefined1 local_ef40 [64];
  undefined1 local_ef00 [64];
  undefined1 local_eec0 [64];
  undefined1 local_ee80 [64];
  undefined1 local_ee40 [64];
  undefined1 local_ee00 [64];
  undefined1 local_edc0 [64];
  undefined1 local_ed80 [64];
  undefined1 local_ed40 [64];
  undefined1 local_ed00 [64];
  undefined1 local_ecc0 [64];
  undefined1 local_ec80 [64];
  undefined1 local_ec40 [64];
  undefined1 local_ec00 [64];
  undefined1 local_ebc0 [64];
  undefined1 local_eb80 [64];
  undefined1 local_eb40 [64];
  undefined1 local_eb00 [64];
  undefined1 local_eac0 [64];
  undefined1 local_ea80 [64];
  undefined1 local_ea40 [64];
  undefined1 local_ea00 [64];
  undefined1 local_e9c0 [64];
  undefined1 local_e980 [64];
  undefined1 local_e940 [64];
  undefined1 local_e900 [64];
  undefined1 local_e8c0 [64];
  undefined1 local_e880 [64];
  undefined1 local_e840 [64];
  undefined1 local_e800 [64];
  undefined1 local_e7c0 [64];
  undefined1 local_e780 [64];
  undefined1 local_e740 [64];
  undefined1 local_e700 [64];
  undefined1 local_e6c0 [64];
  undefined1 local_e680 [64];
  undefined1 local_e640 [64];
  undefined1 local_e600 [64];
  undefined1 local_e5c0 [64];
  undefined1 local_e580 [64];
  undefined1 local_e540 [64];
  undefined1 local_e500 [64];
  undefined1 local_e4c0 [64];
  undefined1 local_e480 [64];
  undefined1 local_e440 [64];
  undefined8 local_e400;
  undefined8 uStack_e3f8;
  undefined8 uStack_e3f0;
  undefined8 uStack_e3e8;
  undefined8 uStack_e3e0;
  undefined8 uStack_e3d8;
  undefined8 uStack_e3d0;
  undefined8 uStack_e3c8;
  undefined8 local_e3c0;
  undefined8 uStack_e3b8;
  undefined8 uStack_e3b0;
  undefined8 uStack_e3a8;
  undefined8 uStack_e3a0;
  undefined8 uStack_e398;
  undefined8 uStack_e390;
  undefined8 uStack_e388;
  undefined8 local_e380;
  undefined8 uStack_e378;
  undefined8 uStack_e370;
  undefined8 uStack_e368;
  undefined8 uStack_e360;
  undefined8 uStack_e358;
  undefined8 uStack_e350;
  undefined8 uStack_e348;
  undefined8 local_e340;
  undefined8 uStack_e338;
  undefined8 uStack_e330;
  undefined8 uStack_e328;
  undefined8 uStack_e320;
  undefined8 uStack_e318;
  undefined8 uStack_e310;
  undefined8 uStack_e308;
  undefined1 local_e300 [64];
  undefined1 local_e2c0 [64];
  undefined1 local_e280 [64];
  undefined1 local_e240 [64];
  undefined1 local_e200 [64];
  undefined1 local_e1c0 [64];
  undefined1 local_e180 [64];
  undefined1 local_e140 [64];
  undefined1 local_e100 [64];
  undefined1 local_e0c0 [64];
  undefined1 local_e080 [64];
  undefined1 local_e040 [64];
  undefined1 local_e000 [64];
  undefined1 local_dfc0 [64];
  undefined1 local_df80 [64];
  undefined1 local_df40 [64];
  undefined1 local_df00 [64];
  undefined1 local_dec0 [64];
  undefined1 local_de80 [64];
  undefined1 local_de40 [64];
  undefined1 local_de00 [64];
  undefined1 local_ddc0 [64];
  undefined1 local_dd80 [64];
  undefined1 local_dd40 [64];
  undefined8 local_dd00;
  undefined8 uStack_dcf8;
  undefined8 uStack_dcf0;
  undefined8 uStack_dce8;
  undefined8 uStack_dce0;
  undefined8 uStack_dcd8;
  undefined8 uStack_dcd0;
  undefined8 uStack_dcc8;
  undefined8 local_dcc0;
  undefined8 uStack_dcb8;
  undefined8 uStack_dcb0;
  undefined8 uStack_dca8;
  undefined8 uStack_dca0;
  undefined8 uStack_dc98;
  undefined8 uStack_dc90;
  undefined8 uStack_dc88;
  undefined1 local_dc80 [64];
  undefined1 local_dc40 [64];
  undefined1 local_dc00 [64];
  undefined1 local_dbc0 [64];
  undefined1 local_db80 [64];
  undefined1 local_db40 [64];
  ulong local_db00;
  undefined8 uStack_daf8;
  undefined8 uStack_daf0;
  undefined8 uStack_dae8;
  undefined8 uStack_dae0;
  undefined8 uStack_dad8;
  undefined8 uStack_dad0;
  undefined8 uStack_dac8;
  ChElementHexaANCF_3843 *local_dac0;
  undefined8 uStack_dab8;
  undefined8 uStack_dab0;
  undefined8 uStack_daa8;
  undefined8 uStack_daa0;
  undefined8 uStack_da98;
  undefined8 uStack_da90;
  undefined8 uStack_da88;
  long local_da80;
  undefined8 uStack_da78;
  undefined8 uStack_da70;
  undefined8 uStack_da68;
  undefined8 uStack_da60;
  undefined8 uStack_da58;
  undefined8 uStack_da50;
  undefined8 uStack_da48;
  double *local_da40;
  undefined8 uStack_da38;
  undefined8 uStack_da30;
  undefined8 uStack_da28;
  undefined8 uStack_da20;
  undefined8 uStack_da18;
  undefined8 uStack_da10;
  undefined8 uStack_da08;
  long local_da00;
  undefined8 uStack_d9f8;
  undefined8 uStack_d9f0;
  undefined8 uStack_d9e8;
  undefined8 uStack_d9e0;
  undefined8 uStack_d9d8;
  undefined8 uStack_d9d0;
  undefined8 uStack_d9c8;
  long local_d9c0;
  undefined8 uStack_d9b8;
  undefined8 uStack_d9b0;
  undefined8 uStack_d9a8;
  undefined8 uStack_d9a0;
  undefined8 uStack_d998;
  undefined8 uStack_d990;
  undefined8 uStack_d988;
  undefined8 local_d980;
  undefined8 uStack_d978;
  undefined8 uStack_d970;
  undefined8 uStack_d968;
  undefined8 uStack_d960;
  undefined8 uStack_d958;
  undefined8 uStack_d950;
  undefined8 uStack_d948;
  undefined8 local_d940;
  undefined8 uStack_d938;
  undefined8 uStack_d930;
  undefined8 uStack_d928;
  undefined8 uStack_d920;
  undefined8 uStack_d918;
  undefined8 uStack_d910;
  undefined8 uStack_d908;
  double local_d900;
  undefined8 uStack_d8f8;
  undefined8 uStack_d8f0;
  undefined8 uStack_d8e8;
  undefined8 uStack_d8e0;
  undefined8 uStack_d8d8;
  undefined8 uStack_d8d0;
  undefined8 uStack_d8c8;
  long local_d8c0;
  undefined8 uStack_d8b8;
  undefined8 uStack_d8b0;
  undefined8 uStack_d8a8;
  undefined8 uStack_d8a0;
  undefined8 uStack_d898;
  undefined8 uStack_d890;
  undefined8 uStack_d888;
  long local_d880;
  undefined8 uStack_d878;
  undefined8 uStack_d870;
  undefined8 uStack_d868;
  undefined8 uStack_d860;
  undefined8 uStack_d858;
  undefined8 uStack_d850;
  undefined8 uStack_d848;
  long local_d840;
  undefined8 uStack_d838;
  undefined8 uStack_d830;
  undefined8 uStack_d828;
  undefined8 uStack_d820;
  undefined8 uStack_d818;
  undefined8 uStack_d810;
  undefined8 uStack_d808;
  ulong local_d800;
  undefined8 uStack_d7f8;
  undefined8 uStack_d7f0;
  undefined8 uStack_d7e8;
  undefined8 uStack_d7e0;
  undefined8 uStack_d7d8;
  undefined8 uStack_d7d0;
  undefined8 uStack_d7c8;
  PointerType local_d7c0;
  undefined8 uStack_d7b8;
  undefined8 uStack_d7b0;
  undefined8 uStack_d7a8;
  undefined8 uStack_d7a0;
  undefined8 uStack_d798;
  undefined8 uStack_d790;
  undefined8 uStack_d788;
  PointerType local_d780;
  undefined8 uStack_d778;
  undefined8 uStack_d770;
  undefined8 uStack_d768;
  undefined8 uStack_d760;
  undefined8 uStack_d758;
  undefined8 uStack_d750;
  undefined8 uStack_d748;
  PointerType local_d740;
  undefined8 uStack_d738;
  undefined8 uStack_d730;
  undefined8 uStack_d728;
  undefined8 uStack_d720;
  undefined8 uStack_d718;
  undefined8 uStack_d710;
  undefined8 uStack_d708;
  undefined1 local_d700 [16];
  DenseStorage<double,__1,__1,__1,_1> *local_d6f0;
  undefined8 local_d6e8;
  undefined8 uStack_d6e0;
  long local_d6d8;
  undefined1 auStack_d6c0 [4160];
  Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_c680;
  MatrixNx6 *pMStack_c678;
  long lStack_c670;
  double dStack_c650;
  double *local_c640 [2];
  long lStack_c630;
  double dStack_c620;
  double *pdStack_c610;
  long local_c600;
  double dStack_c5f0;
  double *pdStack_c5e0;
  long lStack_c5d0;
  double local_c5c0 [2];
  double *pdStack_c5b0;
  long lStack_c5a0;
  double dStack_c590;
  double *local_c580;
  long lStack_c570;
  double dStack_c560;
  double *pdStack_c550;
  long local_c540;
  undefined1 local_c0c0 [47680];
  MatrixNx6 local_680;
  
  pCStack_12bf8 = H;
  dStack_12bd0 = Kfactor;
  uStack_12bc8 = in_XMM0_Qb;
  dStack_125a0 = Mfactor;
  dStack_12380 = Rfactor;
  uStack_12378 = in_XMM1_Qb;
  CalcCombinedCoordMatrix(this,&local_680);
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
      != 0x20) {
    pcVar65 = 
    "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, 32, 6, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, 32, 6, 1>, Option = 0]"
    ;
LAB_0070d12b:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar65);
  }
  local_c680.m_matrix = &this->m_SD;
  pMStack_c678 = &local_680;
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
      != 0xc0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 192, 6, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 192, 6, 0>]"
                 );
  }
  pdVar81 = (double *)auStack_11cc0;
  memset(pdVar81,0,0x2400);
  alpha = &local_f600;
  local_f600 = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::Matrix<double,32,6,1,32,6>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,192,6,0,192,6>>
            ((Matrix<double,_192,_6,_0,_192,_6> *)pdVar81,&local_c680,&local_680,alpha);
  DStack_12bf0.m_data = (double *)0x0;
  DStack_12bf0.m_rows = 0;
  DStack_12bf0.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&DStack_12bf0,0x9000,0x60,0x180);
  lVar62 = 0;
  lVar63 = 0;
  do {
    if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows <= lVar63) ||
         (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols, lVar72 < 0x40)) || (DStack_12bf0.m_rows <= lVar62)) ||
       (DStack_12bf0.m_cols < 0x40)) goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    lVar71 = DStack_12bf0.m_cols * lVar62;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72),auStack_11cc0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 8),auStack_11c80);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 8) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x10),auStack_11c40);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x10) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x18),auStack_11c00);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x18) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x20),auStack_11bc0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x20) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x28),auStack_11b80);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x28) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x30),auStack_11b40);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x30) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x38),auStack_11b00);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x38) = auVar84;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar63) ||
        (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar72 < 0x80)) || (DStack_12bf0.m_cols < 0x80))
    goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x40),auStack_11ac0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x40) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x48),auStack_11a80);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x48) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x50),auStack_11a40);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x50) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x58),auStack_11a00);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x58) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x60),auStack_119c0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x60) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x68),auStack_11980);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x68) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x70),auStack_11940);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x70) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x78),auStack_11900);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x78) = auVar84;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar63) ||
        (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar72 < 0xc0)) || (DStack_12bf0.m_cols < 0xc0))
    goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x80),auStack_118c0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x80) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x88),auStack_11880);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x88) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x90),auStack_11840);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x90) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x98),auStack_11800);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x98) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa0),auStack_117c0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xa0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa8),auStack_11780);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xa8) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb0),auStack_11740);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xb0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb8),auStack_11700);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xb8) = auVar84;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar63) ||
        (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar72 < 0xc0)) || (DStack_12bf0.m_cols < 0x100))
    goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x80),auStack_11ac0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x40),auStack_118c0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xc0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x88),auStack_11a80);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x48),auStack_11880);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 200) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x90),auStack_11a40);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x50),auStack_11840);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xd0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x98),auStack_11a00);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x58),auStack_11800);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xd8) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa0),auStack_119c0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x60),auStack_117c0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xe0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa8),auStack_11980);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x68),auStack_11780);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xe8) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb0),auStack_11940);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x70),auStack_11740);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xf0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb8),auStack_11900);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x78),auStack_11700);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xf8) = auVar84;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar63) ||
        (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar72 < 0xc0)) || (DStack_12bf0.m_cols < 0x140))
    goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x80),auStack_11cc0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72),auStack_118c0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x100) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x88),auStack_11c80);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 8),auStack_11880);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x108) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x90),auStack_11c40);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x10),auStack_11840);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x110) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x98),auStack_11c00);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x18),auStack_11800);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x118) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa0),auStack_11bc0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x20),auStack_117c0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x120) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa8),auStack_11b80);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x28),auStack_11780);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x128) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb0),auStack_11b40);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x30),auStack_11740);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x130) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb8),auStack_11b00);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x38),auStack_11700);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x138) = auVar84;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar63) ||
        (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar72 < 0x80)) || (DStack_12bf0.m_cols < 0x180))
    goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x40),auStack_11cc0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72),auStack_11ac0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x140) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x48),auStack_11c80);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 8),auStack_11a80);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x148) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x50),auStack_11c40);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x10),auStack_11a40);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x150) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x58),auStack_11c00);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x18),auStack_11a00);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x158) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x60),auStack_11bc0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x20),auStack_119c0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x160) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x68),auStack_11b80);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x28),auStack_11980);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x168) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x70),auStack_11b40);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x30),auStack_11940);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x170) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x78),auStack_11b00);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x38),auStack_11900);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x178) = auVar84;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar63) ||
        (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar72 < 0x40)) || (DStack_12bf0.m_rows <= lVar62 + 1))
    goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    lVar71 = (lVar62 + 1) * DStack_12bf0.m_cols;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72),auStack_116c0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 8),auStack_11680);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 8) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x10),auStack_11640);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x10) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x18),auStack_11600);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x18) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x20),auStack_115c0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x20) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x28),auStack_11580);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x28) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x30),auStack_11540);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x30) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x38),auStack_11500);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x38) = auVar84;
    if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows <= lVar63) ||
       (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols, lVar72 < 0x80)) goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x40),auStack_114c0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x40) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x48),auStack_11480);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x48) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x50),auStack_11440);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x50) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x58),auStack_11400);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x58) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x60),auStack_113c0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x60) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x68),auStack_11380);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x68) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x70),auStack_11340);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x70) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x78),auStack_11300);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x78) = auVar84;
    if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows <= lVar63) ||
       (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols, lVar72 < 0xc0)) goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x80),auStack_112c0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x80) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x88),auStack_11280);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x88) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x90),auStack_11240);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x90) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x98),auStack_11200);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x98) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa0),auStack_111c0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xa0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa8),auStack_11180);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xa8) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb0),auStack_11140);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xb0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb8),auStack_11100);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xb8) = auVar84;
    if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows <= lVar63) ||
       (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols, lVar72 < 0xc0)) goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x80),auStack_114c0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x40),auStack_112c0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xc0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x88),auStack_11480);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x48),auStack_11280);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 200) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x90),auStack_11440);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x50),auStack_11240);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xd0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x98),auStack_11400);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x58),auStack_11200);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xd8) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa0),auStack_113c0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x60),auStack_111c0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xe0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa8),auStack_11380);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x68),auStack_11180);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xe8) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb0),auStack_11340);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x70),auStack_11140);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xf0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb8),auStack_11300);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x78),auStack_11100);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xf8) = auVar84;
    if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows <= lVar63) ||
       (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols, lVar72 < 0xc0)) goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x80),auStack_116c0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72),auStack_112c0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x100) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x88),auStack_11680);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 8),auStack_11280);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x108) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x90),auStack_11640);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x10),auStack_11240);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x110) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x98),auStack_11600);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x18),auStack_11200);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x118) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa0),auStack_115c0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x20),auStack_111c0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x120) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa8),auStack_11580);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x28),auStack_11180);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x128) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb0),auStack_11540);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x30),auStack_11140);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x130) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb8),auStack_11500);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x38),auStack_11100);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x138) = auVar84;
    if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows <= lVar63) ||
       (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols, lVar72 < 0x80)) goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x40),auStack_116c0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72),auStack_114c0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x140) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x48),auStack_11680);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 8),auStack_11480);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x148) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x50),auStack_11640);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x10),auStack_11440);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x150) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x58),auStack_11600);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x18),auStack_11400);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x158) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x60),auStack_115c0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x20),auStack_113c0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x160) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x68),auStack_11580);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x28),auStack_11380);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x168) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x70),auStack_11540);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x30),auStack_11340);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x170) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x78),auStack_11500);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x38),auStack_11300);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x178) = auVar84;
    if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows <= lVar63) ||
       ((lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar72 < 0x40 ||
        (lVar71 = lVar62 + 2, DStack_12bf0.m_rows <= lVar71)))) goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    lVar66 = DStack_12bf0.m_cols * lVar71;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72),auStack_110c0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar66) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 8),auStack_11080);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar66 + 8) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x10),auStack_11040);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar66 + 0x10) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x18),auStack_11000);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar66 + 0x18) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x20),auStack_10fc0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar66 + 0x20) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x28),auStack_10f80);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar66 + 0x28) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x30),auStack_10f40);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar66 + 0x30) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x38),auStack_10f00);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar66 + 0x38) = auVar84;
    if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows <= lVar63) ||
       (((lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols, lVar72 < 0x80 || (DStack_12bf0.m_rows <= lVar71)) ||
        (DStack_12bf0.m_cols < 0x80)))) goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    lVar71 = lVar71 * DStack_12bf0.m_cols;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x40),auStack_10ec0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x40) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x48),auStack_10e80);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x48) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x50),auStack_10e40);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x50) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x58),auStack_10e00);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x58) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x60),auStack_10dc0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x60) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x68),auStack_10d80);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x68) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x70),auStack_10d40);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x70) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x78),auStack_10d00);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x78) = auVar84;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar63) ||
        (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar72 < 0xc0)) || (DStack_12bf0.m_cols < 0xc0))
    goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x80),auStack_10cc0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x80) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x88),auStack_10c80);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x88) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x90),auStack_10c40);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x90) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x98),auStack_10c00);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x98) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa0),auStack_10bc0);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xa0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa8),auStack_10b80);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xa8) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb0),auStack_10b40);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xb0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb8),auStack_10b00);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xb8) = auVar84;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar63) ||
        (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar72 < 0xc0)) || (DStack_12bf0.m_cols < 0x100))
    goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x80),auStack_10ec0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x40),auStack_10cc0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xc0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x88),auStack_10e80);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x48),auStack_10c80);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 200) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x90),auStack_10e40);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x50),auStack_10c40);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xd0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x98),auStack_10e00);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x58),auStack_10c00);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xd8) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa0),auStack_10dc0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x60),auStack_10bc0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xe0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa8),auStack_10d80);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x68),auStack_10b80);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xe8) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb0),auStack_10d40);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x70),auStack_10b40);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xf0) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb8),auStack_10d00);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x78),auStack_10b00);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0xf8) = auVar84;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar63) ||
        (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar72 < 0xc0)) || (DStack_12bf0.m_cols < 0x140))
    goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x80),auStack_110c0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72),auStack_10cc0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x100) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x88),auStack_11080);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 8),auStack_10c80);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x108) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x90),auStack_11040);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x10),auStack_10c40);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x110) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x98),auStack_11000);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x18),auStack_10c00);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x118) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa0),auStack_10fc0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x20),auStack_10bc0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x120) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xa8),auStack_10f80);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x28),auStack_10b80);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x128) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb0),auStack_10f40);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x30),auStack_10b40);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x130) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0xb8),auStack_10f00);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x38),auStack_10b00);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x138) = auVar84;
    if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows <= lVar63) ||
        (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar72 < 0x80)) || (DStack_12bf0.m_cols < 0x180))
    goto LAB_0070d0f4;
    pdVar68 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    lVar72 = lVar72 * lVar63;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x40),auStack_110c0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72),auStack_10ec0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x140) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x48),auStack_11080);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 8),auStack_10e80);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x148) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x50),auStack_11040);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x10),auStack_10e40);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x150) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x58),auStack_11000);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x18),auStack_10e00);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x158) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x60),auStack_10fc0);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x20),auStack_10dc0);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x160) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x68),auStack_10f80);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x28),auStack_10d80);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x168) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x70),auStack_10f40);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x30),auStack_10d40);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x170) = auVar84;
    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x78),auStack_10f00);
    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar68 + lVar72 + 0x38),auStack_10d00);
    auVar84 = vaddpd_avx512f(auVar84,auVar85);
    *(undefined1 (*) [64])(DStack_12bf0.m_data + lVar71 + 0x178) = auVar84;
    lVar63 = lVar63 + 1;
    lVar62 = lVar62 + 3;
  } while (lVar63 != 0x20);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = this->m_Alpha;
  auVar50._8_8_ = uStack_12bc8;
  auVar50._0_8_ = dStack_12bd0;
  auVar52._8_8_ = uStack_12378;
  auVar52._0_8_ = dStack_12380;
  auVar50 = vfmadd213sd_fma(auVar52,auVar96,auVar50);
  auVar84 = vbroadcastsd_avx512f(auVar50);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = this->m_Alpha * dStack_12bd0;
  auVar85 = vbroadcastsd_avx512f(auVar97);
  lVar62 = 0;
  do {
    uVar67 = 0xfffffffffffffff8;
    do {
      auVar86 = vmulpd_avx512f(auVar84,*(undefined1 (*) [64])(pdVar81 + uVar67 + 8));
      auVar87 = vmulpd_avx512f(auVar85,*(undefined1 (*) [64])(pdVar81 + uVar67 + 0x248));
      auVar86 = vaddpd_avx512f(auVar86,auVar87);
      *(undefined1 (*) [64])(alpha + uVar67 + 8) = auVar86;
      uVar67 = uVar67 + 8;
    } while (uVar67 < 0xb8);
    lVar62 = lVar62 + 1;
    pdVar81 = pdVar81 + 0xc0;
    alpha = alpha + 0xc0;
  } while (lVar62 != 3);
  if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_rows == 0x40) &&
     ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols == 1)) {
    pauVar70 = (undefined1 (*) [64])
               (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
    lVar62 = 0x5c0;
    do {
      auVar84 = vmulpd_avx512f(*pauVar70,*(undefined1 (*) [64])(local_fbc0 + lVar62));
      *(undefined1 (*) [64])(local_fbc0 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[1],*(undefined1 (*) [64])(local_fb80 + lVar62));
      *(undefined1 (*) [64])(local_fb80 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[2],*(undefined1 (*) [64])(local_fb40 + lVar62));
      *(undefined1 (*) [64])(local_fb40 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[3],*(undefined1 (*) [64])(local_fb00 + lVar62));
      *(undefined1 (*) [64])(local_fb00 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[4],*(undefined1 (*) [64])(local_fac0 + lVar62));
      *(undefined1 (*) [64])(local_fac0 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[5],*(undefined1 (*) [64])(local_fa80 + lVar62));
      *(undefined1 (*) [64])(local_fa80 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[6],*(undefined1 (*) [64])(local_fa40 + lVar62));
      *(undefined1 (*) [64])(local_fa40 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[7],*(undefined1 (*) [64])(local_fa00 + lVar62));
      *(undefined1 (*) [64])(local_fa00 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(*pauVar70,*(undefined1 (*) [64])(local_f9c0 + lVar62));
      *(undefined1 (*) [64])(local_f9c0 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[1],*(undefined1 (*) [64])(local_f980 + lVar62));
      *(undefined1 (*) [64])(local_f980 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[2],*(undefined1 (*) [64])(local_f940 + lVar62));
      *(undefined1 (*) [64])(local_f940 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[3],*(undefined1 (*) [64])(local_f900 + lVar62));
      *(undefined1 (*) [64])(local_f900 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[4],*(undefined1 (*) [64])((long)&local_f8c0 + lVar62));
      *(undefined1 (*) [64])((long)&local_f8c0 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[5],*(undefined1 (*) [64])((long)&local_f880 + lVar62));
      *(undefined1 (*) [64])((long)&local_f880 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[6],*(undefined1 (*) [64])((long)&local_f840 + lVar62));
      *(undefined1 (*) [64])((long)&local_f840 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[7],*(undefined1 (*) [64])((long)&local_f800 + lVar62));
      *(undefined1 (*) [64])((long)&local_f800 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(*pauVar70,*(undefined1 (*) [64])((long)&local_f7c0 + lVar62));
      *(undefined1 (*) [64])((long)&local_f7c0 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[1],*(undefined1 (*) [64])((long)&local_f780 + lVar62));
      *(undefined1 (*) [64])((long)&local_f780 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[2],*(undefined1 (*) [64])((long)&local_f740 + lVar62));
      *(undefined1 (*) [64])((long)&local_f740 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[3],*(undefined1 (*) [64])((long)&local_f700 + lVar62));
      *(undefined1 (*) [64])((long)&local_f700 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[4],*(undefined1 (*) [64])((long)&local_f6c0 + lVar62));
      *(undefined1 (*) [64])((long)&local_f6c0 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[5],*(undefined1 (*) [64])((long)&local_f680 + lVar62));
      *(undefined1 (*) [64])((long)&local_f680 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[6],*(undefined1 (*) [64])((long)&local_f640 + lVar62));
      *(undefined1 (*) [64])((long)&local_f640 + lVar62) = auVar84;
      auVar84 = vmulpd_avx512f(pauVar70[7],*(undefined1 (*) [64])(auStack_f5f8 + lVar62 + -8));
      *(undefined1 (*) [64])(auStack_f5f8 + lVar62 + -8) = auVar84;
      lVar62 = lVar62 + 0x600;
    } while (lVar62 != 0x17c0);
    DStack_12c30.m_data = (double *)0x0;
    DStack_12c30.m_rows = 0;
    DStack_12c30.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&DStack_12c30,0x9000,0x60,0x180);
    lVar62 = 0;
    lVar63 = 0;
    do {
      if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar63) ||
           (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar72 < 0x40)) || (DStack_12c30.m_rows <= lVar62)) ||
         (DStack_12c30.m_cols < 0x40)) goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      lVar71 = DStack_12c30.m_cols * lVar62;
      auVar84._8_56_ = auStack_f5f8;
      auVar84._0_8_ = local_f600;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72),auVar84);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 8),local_f5c0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 8) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x10),local_f580);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x10) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x18),local_f540);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x18) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x20),local_f500);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x20) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x28),local_f4c0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x28) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x30),local_f480);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x30) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x38),local_f440);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x38) = auVar84;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar63) ||
          (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar72 < 0x80)) || (DStack_12c30.m_cols < 0x80))
      goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x40),local_f400);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x40) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x48),local_f3c0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x48) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x50),local_f380);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x50) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x58),local_f340);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x58) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x60),local_f300);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x60) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x68),local_f2c0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x68) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x70),local_f280);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x70) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x78),local_f240);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x78) = auVar84;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar63) ||
          (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar72 < 0xc0)) || (DStack_12c30.m_cols < 0xc0))
      goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x80),local_f200);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x80) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x88),local_f1c0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x88) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x90),local_f180);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x90) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x98),local_f140);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x98) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa0),local_f100);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xa0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa8),local_f0c0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xa8) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb0),local_f080);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xb0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb8),local_f040);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xb8) = auVar84;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar63) ||
          (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar72 < 0xc0)) || (DStack_12c30.m_cols < 0x100))
      goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x80),local_f400);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x40),local_f200);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xc0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x88),local_f3c0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x48),local_f1c0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 200) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x90),local_f380);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x50),local_f180);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xd0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x98),local_f340);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x58),local_f140);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xd8) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa0),local_f300);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x60),local_f100);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xe0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa8),local_f2c0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x68),local_f0c0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xe8) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb0),local_f280);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x70),local_f080);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xf0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb8),local_f240);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x78),local_f040);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xf8) = auVar84;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar63) ||
          (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar72 < 0xc0)) || (DStack_12c30.m_cols < 0x140))
      goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      auVar85._8_56_ = auStack_f5f8;
      auVar85._0_8_ = local_f600;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x80),auVar85);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72),local_f200);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x100) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x88),local_f5c0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 8),local_f1c0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x108) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x90),local_f580);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x10),local_f180);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x110) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x98),local_f540);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x18),local_f140);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x118) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa0),local_f500);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x20),local_f100);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x120) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa8),local_f4c0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x28),local_f0c0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x128) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb0),local_f480);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x30),local_f080);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x130) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb8),local_f440);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x38),local_f040);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x138) = auVar84;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar63) ||
          (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar72 < 0x80)) || (DStack_12c30.m_cols < 0x180))
      goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      auVar86._8_56_ = auStack_f5f8;
      auVar86._0_8_ = local_f600;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x40),auVar86);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72),local_f400);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x140) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x48),local_f5c0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 8),local_f3c0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x148) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x50),local_f580);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x10),local_f380);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x150) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x58),local_f540);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x18),local_f340);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x158) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x60),local_f500);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x20),local_f300);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x160) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x68),local_f4c0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x28),local_f2c0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x168) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x70),local_f480);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x30),local_f280);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x170) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x78),local_f440);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x38),local_f240);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x178) = auVar84;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar63) ||
          (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar72 < 0x40)) || (DStack_12c30.m_rows <= lVar62 + 1))
      goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      lVar71 = (lVar62 + 1) * DStack_12c30.m_cols;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72),local_f000);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 8),local_efc0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 8) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x10),local_ef80);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x10) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x18),local_ef40);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x18) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x20),local_ef00);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x20) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x28),local_eec0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x28) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x30),local_ee80);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x30) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x38),local_ee40);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x38) = auVar84;
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows <= lVar63) ||
         (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols, lVar72 < 0x80)) goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x40),local_ee00);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x40) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x48),local_edc0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x48) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x50),local_ed80);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x50) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x58),local_ed40);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x58) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x60),local_ed00);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x60) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x68),local_ecc0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x68) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x70),local_ec80);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x70) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x78),local_ec40);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x78) = auVar84;
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows <= lVar63) ||
         (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols, lVar72 < 0xc0)) goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x80),local_ec00);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x80) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x88),local_ebc0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x88) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x90),local_eb80);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x90) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x98),local_eb40);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x98) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa0),local_eb00);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xa0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa8),local_eac0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xa8) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb0),local_ea80);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xb0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb8),local_ea40);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xb8) = auVar84;
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows <= lVar63) ||
         (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols, lVar72 < 0xc0)) goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x80),local_ee00);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x40),local_ec00);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xc0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x88),local_edc0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x48),local_ebc0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 200) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x90),local_ed80);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x50),local_eb80);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xd0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x98),local_ed40);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x58),local_eb40);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xd8) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa0),local_ed00);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x60),local_eb00);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xe0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa8),local_ecc0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x68),local_eac0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xe8) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb0),local_ec80);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x70),local_ea80);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xf0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb8),local_ec40);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x78),local_ea40);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0xf8) = auVar84;
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows <= lVar63) ||
         (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols, lVar72 < 0xc0)) goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x80),local_f000);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72),local_ec00);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x100) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x88),local_efc0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 8),local_ebc0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x108) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x90),local_ef80);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x10),local_eb80);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x110) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x98),local_ef40);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x18),local_eb40);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x118) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa0),local_ef00);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x20),local_eb00);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x120) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa8),local_eec0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x28),local_eac0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x128) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb0),local_ee80);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x30),local_ea80);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x130) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb8),local_ee40);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x38),local_ea40);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x138) = auVar84;
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows <= lVar63) ||
         (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols, lVar72 < 0x80)) goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x40),local_f000);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72),local_ee00);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x140) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x48),local_efc0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 8),local_edc0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x148) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x50),local_ef80);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x10),local_ed80);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x150) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x58),local_ef40);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x18),local_ed40);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x158) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x60),local_ef00);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x20),local_ed00);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x160) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x68),local_eec0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x28),local_ecc0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x168) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x70),local_ee80);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x30),local_ec80);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x170) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x78),local_ee40);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x38),local_ec40);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x178) = auVar84;
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows <= lVar63) ||
         ((lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar72 < 0x40 ||
          (lVar71 = lVar62 + 2, DStack_12c30.m_rows <= lVar71)))) goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      lVar66 = DStack_12c30.m_cols * lVar71;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72),local_ea00);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 8),local_e9c0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 8) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x10),local_e980);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x10) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x18),local_e940);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x18) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x20),local_e900);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x20) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x28),local_e8c0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x28) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x30),local_e880);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x30) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x38),local_e840);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x38) = auVar84;
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows <= lVar63) ||
         (((lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar72 < 0x80 || (DStack_12c30.m_rows <= lVar71)) ||
          (DStack_12c30.m_cols < 0x80)))) goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      lVar66 = DStack_12c30.m_cols * lVar71;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x40),local_e800);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x40) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x48),local_e7c0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x48) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x50),local_e780);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x50) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x58),local_e740);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x58) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x60),local_e700);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x60) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x68),local_e6c0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x68) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x70),local_e680);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x70) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x78),local_e640);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x78) = auVar84;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar63) ||
          (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar72 < 0xc0)) || (DStack_12c30.m_cols < 0xc0))
      goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x80),local_e600);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x80) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x88),local_e5c0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x88) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x90),local_e580);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x90) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x98),local_e540);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x98) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa0),local_e500);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0xa0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa8),local_e4c0);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0xa8) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb0),local_e480);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0xb0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb8),local_e440);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0xb8) = auVar84;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar63) ||
          (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar72 < 0xc0)) || (DStack_12c30.m_cols < 0x100))
      goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x80),local_e800);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x40),local_e600);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0xc0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x88),local_e7c0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x48),local_e5c0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 200) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x90),local_e780);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x50),local_e580);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0xd0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x98),local_e740);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x58),local_e540);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0xd8) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa0),local_e700);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x60),local_e500);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0xe0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa8),local_e6c0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x68),local_e4c0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0xe8) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb0),local_e680);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x70),local_e480);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0xf0) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb8),local_e640);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x78),local_e440);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0xf8) = auVar84;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar63) ||
          (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar72 < 0xc0)) || (DStack_12c30.m_cols < 0x140))
      goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x80),local_ea00);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72),local_e600);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x100) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x88),local_e9c0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 8),local_e5c0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x108) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x90),local_e980);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x10),local_e580);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x110) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x98),local_e940);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x18),local_e540);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x118) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa0),local_e900);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x20),local_e500);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x120) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xa8),local_e8c0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x28),local_e4c0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x128) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb0),local_e880);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x30),local_e480);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x130) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0xb8),local_e840);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x38),local_e440);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar66 + 0x138) = auVar84;
      if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows <= lVar63) ||
          (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_cols, lVar72 < 0x80)) ||
         ((DStack_12c30.m_rows <= lVar71 || (DStack_12c30.m_cols < 0x180)))) goto LAB_0070d0f4;
      pdVar81 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
      lVar72 = lVar72 * lVar63;
      lVar71 = DStack_12c30.m_cols * lVar71;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x40),local_ea00);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72),local_e800);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x140) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x48),local_e9c0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 8),local_e7c0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x148) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x50),local_e980);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x10),local_e780);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x150) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x58),local_e940);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x18),local_e740);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x158) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x60),local_e900);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x20),local_e700);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x160) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x68),local_e8c0);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x28),local_e6c0);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x168) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x70),local_e880);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x30),local_e680);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x170) = auVar84;
      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x78),local_e840);
      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar81 + lVar72 + 0x38),local_e640);
      auVar84 = vaddpd_avx512f(auVar84,auVar85);
      *(undefined1 (*) [64])(DStack_12c30.m_data + lVar71 + 0x178) = auVar84;
      lVar63 = lVar63 + 1;
      lVar62 = lVar62 + 3;
    } while (lVar63 != 0x20);
    peVar47 = (this->m_material).
              super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    this_00 = (this->m_material).
              super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    DStack_12c10.m_data = (double *)0x0;
    DStack_12c10.m_rows = 0;
    DStack_12c10.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&DStack_12c10,0x9000,0x60,0x180);
    auVar85 = auStack_129c0;
    auVar84 = _auStack_12bc0;
    if (((0x5f < DStack_12c30.m_rows) && (0x3f < DStack_12c30.m_cols)) &&
       ((0x7f < DStack_12c30.m_cols &&
        ((((0xbf < DStack_12c30.m_cols && (0xff < DStack_12c30.m_cols)) &&
          (0x13f < DStack_12c30.m_cols)) && (0x17f < DStack_12c30.m_cols)))))) {
      local_d700._0_8_ = DStack_12c10.m_data;
      local_d6e8 = 0;
      uStack_d6e0 = 0;
      local_d6d8 = DStack_12c10.m_cols;
      local_d6f0 = &DStack_12c10;
      if ((0x5f < DStack_12c10.m_rows) && (0x3f < DStack_12c10.m_cols)) {
        pdStack_c610 = DStack_12c30.m_data + 0x40;
        pdStack_c5e0 = DStack_12c30.m_data + 0x80;
        pdStack_c5b0 = DStack_12c30.m_data + 0xc0;
        local_c580 = DStack_12c30.m_data + 0x100;
        local_c640[0] = DStack_12c30.m_data;
        pdStack_c550 = DStack_12c30.m_data + 0x140;
        lStack_c630 = DStack_12c30.m_cols;
        local_c600 = DStack_12c30.m_cols;
        lStack_c5d0 = DStack_12c30.m_cols;
        lStack_c5a0 = DStack_12c30.m_cols;
        lStack_c570 = DStack_12c30.m_cols;
        local_c540 = DStack_12c30.m_cols;
        auStack_129c0._0_8_ = DStack_12c10.m_data;
        auVar86 = auStack_129c0;
        auStack_129c0._24_40_ = auVar85._24_40_;
        auStack_129c0._0_16_ = auVar86._0_16_;
        auStack_129c0._16_8_ = DStack_12c10.m_cols;
        auStack_12bc0._8_8_ = &local_c680;
        auStack_12bc0._0_8_ = auStack_129c0;
        puStack_12bb0 = auStack_127c0;
        auStack_12ba0 = auVar84._32_32_;
        pDStack_12ba8 = (DstXprType *)local_d700;
        dStack_c650 = (peVar47->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                      m_storage.m_data.array[0];
        dStack_c620 = (peVar47->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                      m_storage.m_data.array[1];
        dStack_c5f0 = (peVar47->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                      m_storage.m_data.array[2];
        local_c5c0[0] =
             (peVar47->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
             m_data.array[3];
        dStack_c590 = (peVar47->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                      m_storage.m_data.array[4];
        dStack_c560 = (peVar47->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                      m_storage.m_data.array[5];
        Eigen::internal::dense_assignment_loop<$578d03e2$>::run
                  ((generic_dense_assignment_kernel<_51990d5e_> *)auStack_12bc0);
        auVar85 = auStack_129c0;
        auVar84 = _auStack_12bc0;
        if ((0x5f < DStack_12c30.m_rows) &&
           (((0x3f < DStack_12c30.m_cols && (0x7f < DStack_12c30.m_cols)) &&
            ((0xbf < DStack_12c30.m_cols &&
             (((0xff < DStack_12c30.m_cols && (0x13f < DStack_12c30.m_cols)) &&
              (0x17f < DStack_12c30.m_cols)))))))) {
          local_d700._0_8_ =
               &((DenseStorage<double,__1,__1,__1,_1> *)((long)DStack_12c10.m_data + 0x1f8))->m_rows
          ;
          local_d6e8 = 0;
          uStack_d6e0 = 0x40;
          local_d6d8 = DStack_12c10.m_cols;
          local_d6f0 = &DStack_12c10;
          if ((0x5f < DStack_12c10.m_rows) && (0x7f < DStack_12c10.m_cols)) {
            pdStack_c610 = DStack_12c30.m_data + 0x40;
            pdStack_c5e0 = DStack_12c30.m_data + 0x80;
            pdStack_c5b0 = DStack_12c30.m_data + 0xc0;
            local_c580 = DStack_12c30.m_data + 0x100;
            local_c640[0] = DStack_12c30.m_data;
            pdStack_c550 = DStack_12c30.m_data + 0x140;
            lStack_c630 = DStack_12c30.m_cols;
            local_c600 = DStack_12c30.m_cols;
            lStack_c5d0 = DStack_12c30.m_cols;
            lStack_c5a0 = DStack_12c30.m_cols;
            lStack_c570 = DStack_12c30.m_cols;
            local_c540 = DStack_12c30.m_cols;
            auStack_129c0._0_8_ = local_d700._0_8_;
            auVar86 = auStack_129c0;
            auStack_129c0._24_40_ = auVar85._24_40_;
            auStack_129c0._0_16_ = auVar86._0_16_;
            auStack_129c0._16_8_ = DStack_12c10.m_cols;
            auStack_12bc0._8_8_ = &local_c680;
            puStack_12bb0 = auStack_127c0;
            auStack_12ba0 = auVar84._32_32_;
            dStack_c650 = (peVar47->m_D).
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                          m_data.array[6];
            dStack_c620 = (peVar47->m_D).
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                          m_data.array[7];
            dStack_c5f0 = (peVar47->m_D).
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                          m_data.array[8];
            local_c5c0[0] =
                 (peVar47->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                 m_storage.m_data.array[9];
            dStack_c590 = (peVar47->m_D).
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                          m_data.array[10];
            dStack_c560 = (peVar47->m_D).
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                          m_data.array[0xb];
            Eigen::internal::dense_assignment_loop<$578d03e2$>::run
                      ((generic_dense_assignment_kernel<_51990d5e_> *)auStack_12bc0);
            auVar85 = auStack_129c0;
            auVar84 = _auStack_12bc0;
            if ((0x5f < DStack_12c30.m_rows) &&
               (((0x3f < DStack_12c30.m_cols && (0x7f < DStack_12c30.m_cols)) &&
                ((0xbf < DStack_12c30.m_cols &&
                 (((0xff < DStack_12c30.m_cols && (0x13f < DStack_12c30.m_cols)) &&
                  (0x17f < DStack_12c30.m_cols)))))))) {
              local_d700._0_8_ =
                   &((DenseStorage<double,__1,__1,__1,_1> *)((long)DStack_12c10.m_data + 0x3f0))->
                    m_cols;
              local_d6e8 = 0;
              uStack_d6e0 = 0x80;
              local_d6d8 = DStack_12c10.m_cols;
              local_d6f0 = &DStack_12c10;
              if ((0x5f < DStack_12c10.m_rows) && (0xbf < DStack_12c10.m_cols)) {
                pdStack_c610 = DStack_12c30.m_data + 0x40;
                pdStack_c5e0 = DStack_12c30.m_data + 0x80;
                pdStack_c5b0 = DStack_12c30.m_data + 0xc0;
                local_c580 = DStack_12c30.m_data + 0x100;
                local_c640[0] = DStack_12c30.m_data;
                pdStack_c550 = DStack_12c30.m_data + 0x140;
                lStack_c630 = DStack_12c30.m_cols;
                local_c600 = DStack_12c30.m_cols;
                lStack_c5d0 = DStack_12c30.m_cols;
                lStack_c5a0 = DStack_12c30.m_cols;
                lStack_c570 = DStack_12c30.m_cols;
                local_c540 = DStack_12c30.m_cols;
                auStack_129c0._0_8_ = local_d700._0_8_;
                auVar86 = auStack_129c0;
                auStack_129c0._24_40_ = auVar85._24_40_;
                auStack_129c0._0_16_ = auVar86._0_16_;
                auStack_129c0._16_8_ = DStack_12c10.m_cols;
                auStack_12bc0._8_8_ = &local_c680;
                puStack_12bb0 = auStack_127c0;
                auStack_12ba0 = auVar84._32_32_;
                dStack_c650 = (peVar47->m_D).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                              .m_data.array[0xc];
                dStack_c620 = (peVar47->m_D).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                              .m_data.array[0xd];
                dStack_c5f0 = (peVar47->m_D).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                              .m_data.array[0xe];
                local_c5c0[0] =
                     (peVar47->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0xf];
                dStack_c590 = (peVar47->m_D).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                              .m_data.array[0x10];
                dStack_c560 = (peVar47->m_D).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                              .m_data.array[0x11];
                Eigen::internal::dense_assignment_loop<$578d03e2$>::run
                          ((generic_dense_assignment_kernel<_51990d5e_> *)auStack_12bc0);
                auVar85 = auStack_129c0;
                auVar84 = _auStack_12bc0;
                if ((0x5f < DStack_12c30.m_rows) &&
                   (((0x3f < DStack_12c30.m_cols && (0x7f < DStack_12c30.m_cols)) &&
                    ((0xbf < DStack_12c30.m_cols &&
                     (((0xff < DStack_12c30.m_cols && (0x13f < DStack_12c30.m_cols)) &&
                      (0x17f < DStack_12c30.m_cols)))))))) {
                  local_d700._0_8_ = (long)DStack_12c10.m_data + 0x600;
                  local_d6e8 = 0;
                  uStack_d6e0 = 0xc0;
                  local_d6d8 = DStack_12c10.m_cols;
                  local_d6f0 = &DStack_12c10;
                  if ((0x5f < DStack_12c10.m_rows) && (0xff < DStack_12c10.m_cols)) {
                    pdStack_c610 = DStack_12c30.m_data + 0x40;
                    pdStack_c5e0 = DStack_12c30.m_data + 0x80;
                    pdStack_c5b0 = DStack_12c30.m_data + 0xc0;
                    local_c580 = DStack_12c30.m_data + 0x100;
                    local_c640[0] = DStack_12c30.m_data;
                    pdStack_c550 = DStack_12c30.m_data + 0x140;
                    lStack_c630 = DStack_12c30.m_cols;
                    local_c600 = DStack_12c30.m_cols;
                    lStack_c5d0 = DStack_12c30.m_cols;
                    lStack_c5a0 = DStack_12c30.m_cols;
                    lStack_c570 = DStack_12c30.m_cols;
                    local_c540 = DStack_12c30.m_cols;
                    auStack_129c0._0_8_ = local_d700._0_8_;
                    auVar86 = auStack_129c0;
                    auStack_129c0._24_40_ = auVar85._24_40_;
                    auStack_129c0._0_16_ = auVar86._0_16_;
                    auStack_129c0._16_8_ = DStack_12c10.m_cols;
                    auStack_12bc0._8_8_ = &local_c680;
                    puStack_12bb0 = auStack_127c0;
                    auStack_12ba0 = auVar84._32_32_;
                    dStack_c650 = (peVar47->m_D).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                  m_storage.m_data.array[0x12];
                    dStack_c620 = (peVar47->m_D).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                  m_storage.m_data.array[0x13];
                    dStack_c5f0 = (peVar47->m_D).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                  m_storage.m_data.array[0x14];
                    local_c5c0[0] =
                         (peVar47->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                         .m_storage.m_data.array[0x15];
                    dStack_c590 = (peVar47->m_D).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                  m_storage.m_data.array[0x16];
                    dStack_c560 = (peVar47->m_D).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                  m_storage.m_data.array[0x17];
                    Eigen::internal::dense_assignment_loop<$578d03e2$>::run
                              ((generic_dense_assignment_kernel<_51990d5e_> *)auStack_12bc0);
                    auVar85 = auStack_129c0;
                    auVar84 = _auStack_12bc0;
                    if ((0x5f < DStack_12c30.m_rows) &&
                       (((0x3f < DStack_12c30.m_cols && (0x7f < DStack_12c30.m_cols)) &&
                        ((0xbf < DStack_12c30.m_cols &&
                         (((0xff < DStack_12c30.m_cols && (0x13f < DStack_12c30.m_cols)) &&
                          (0x17f < DStack_12c30.m_cols)))))))) {
                      local_d700._0_8_ =
                           &((DenseStorage<double,__1,__1,__1,_1> *)
                            ((long)DStack_12c10.m_data + 0x7f8))->m_rows;
                      local_d6e8 = 0;
                      uStack_d6e0 = 0x100;
                      local_d6d8 = DStack_12c10.m_cols;
                      local_d6f0 = &DStack_12c10;
                      if ((0x5f < DStack_12c10.m_rows) && (0x13f < DStack_12c10.m_cols)) {
                        pdStack_c610 = DStack_12c30.m_data + 0x40;
                        pdStack_c5e0 = DStack_12c30.m_data + 0x80;
                        pdStack_c5b0 = DStack_12c30.m_data + 0xc0;
                        local_c580 = DStack_12c30.m_data + 0x100;
                        local_c640[0] = DStack_12c30.m_data;
                        pdStack_c550 = DStack_12c30.m_data + 0x140;
                        lStack_c630 = DStack_12c30.m_cols;
                        local_c600 = DStack_12c30.m_cols;
                        lStack_c5d0 = DStack_12c30.m_cols;
                        lStack_c5a0 = DStack_12c30.m_cols;
                        lStack_c570 = DStack_12c30.m_cols;
                        local_c540 = DStack_12c30.m_cols;
                        auStack_129c0._0_8_ = local_d700._0_8_;
                        auVar86 = auStack_129c0;
                        auStack_129c0._24_40_ = auVar85._24_40_;
                        auStack_129c0._0_16_ = auVar86._0_16_;
                        auStack_129c0._16_8_ = DStack_12c10.m_cols;
                        auStack_12bc0._8_8_ = &local_c680;
                        puStack_12bb0 = auStack_127c0;
                        auStack_12ba0 = auVar84._32_32_;
                        dStack_c650 = (peVar47->m_D).
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                      m_storage.m_data.array[0x18];
                        dStack_c620 = (peVar47->m_D).
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                      m_storage.m_data.array[0x19];
                        dStack_c5f0 = (peVar47->m_D).
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                      m_storage.m_data.array[0x1a];
                        local_c5c0[0] =
                             (peVar47->m_D).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                             m_data.array[0x1b];
                        dStack_c590 = (peVar47->m_D).
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                      m_storage.m_data.array[0x1c];
                        dStack_c560 = (peVar47->m_D).
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                      m_storage.m_data.array[0x1d];
                        Eigen::internal::dense_assignment_loop<$578d03e2$>::run
                                  ((generic_dense_assignment_kernel<_51990d5e_> *)auStack_12bc0);
                        auVar85 = auStack_129c0;
                        auVar84 = _auStack_12bc0;
                        if ((0x5f < DStack_12c30.m_rows) &&
                           (((0x3f < DStack_12c30.m_cols && (0x7f < DStack_12c30.m_cols)) &&
                            ((0xbf < DStack_12c30.m_cols &&
                             (((0xff < DStack_12c30.m_cols && (0x13f < DStack_12c30.m_cols)) &&
                              (0x17f < DStack_12c30.m_cols)))))))) {
                          local_d700._0_8_ =
                               &((DenseStorage<double,__1,__1,__1,_1> *)
                                ((long)DStack_12c10.m_data + 0x9f0))->m_cols;
                          local_d6e8 = 0;
                          uStack_d6e0 = 0x140;
                          local_d6d8 = DStack_12c10.m_cols;
                          local_d6f0 = &DStack_12c10;
                          if ((0x5f < DStack_12c10.m_rows) && (0x17f < DStack_12c10.m_cols)) {
                            pdStack_c610 = DStack_12c30.m_data + 0x40;
                            pdStack_c5e0 = DStack_12c30.m_data + 0x80;
                            pdStack_c5b0 = DStack_12c30.m_data + 0xc0;
                            local_c580 = DStack_12c30.m_data + 0x100;
                            local_c640[0] = DStack_12c30.m_data;
                            pdStack_c550 = DStack_12c30.m_data + 0x140;
                            lStack_c630 = DStack_12c30.m_cols;
                            local_c600 = DStack_12c30.m_cols;
                            lStack_c5d0 = DStack_12c30.m_cols;
                            lStack_c5a0 = DStack_12c30.m_cols;
                            lStack_c570 = DStack_12c30.m_cols;
                            local_c540 = DStack_12c30.m_cols;
                            auStack_129c0._0_8_ = local_d700._0_8_;
                            auVar86 = auStack_129c0;
                            auStack_129c0._24_40_ = auVar85._24_40_;
                            auStack_129c0._0_16_ = auVar86._0_16_;
                            auStack_129c0._16_8_ = DStack_12c10.m_cols;
                            auStack_12bc0._8_8_ = &local_c680;
                            puStack_12bb0 = auStack_127c0;
                            auStack_12ba0 = auVar84._32_32_;
                            dStack_c650 = (peVar47->m_D).
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                          .m_storage.m_data.array[0x1e];
                            dStack_c620 = (peVar47->m_D).
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                          .m_storage.m_data.array[0x1f];
                            dStack_c5f0 = (peVar47->m_D).
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                          .m_storage.m_data.array[0x20];
                            local_c5c0[0] =
                                 (peVar47->m_D).
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                 m_storage.m_data.array[0x21];
                            dStack_c590 = (peVar47->m_D).
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                          .m_storage.m_data.array[0x22];
                            dStack_c560 = (peVar47->m_D).
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                          .m_storage.m_data.array[0x23];
                            Eigen::internal::dense_assignment_loop<$578d03e2$>::run
                                      ((generic_dense_assignment_kernel<_51990d5e_> *)auStack_12bc0)
                            ;
                            if (DStack_12bf0.m_cols != DStack_12c10.m_cols) {
                              pcVar65 = 
                              "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Option = 0]"
                              ;
                              goto LAB_0070d12b;
                            }
                            local_d700._0_8_ = &DStack_12bf0;
                            local_d700._8_8_ = &DStack_12c10;
                            Eigen::Matrix<double,-1,-1,0,-1,-1>::
                            Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,0>>
                                      ((Matrix<double,_1,_1,0,_1,_1> *)&local_c680,
                                       (Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_0>
                                        *)local_d700);
                            pCVar82 = pCStack_12bf8;
                            pMVar48 = (MatrixNx6 *)
                                      (pCStack_12bf8->
                                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                      ).
                                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                      .
                                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                      .m_rows.m_value;
                            if ((pMVar48 != pMStack_c678) ||
                               (lVar62 = (pCStack_12bf8->
                                         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                         ).
                                         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                         .
                                         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                         .m_cols.m_value, lVar62 != lStack_c670)) {
                              __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                                            ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                                            "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>]"
                                           );
                            }
                            if (0 < (long)pMVar48) {
                              pdVar69 = (pCStack_12bf8->
                                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                        ).
                                        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                        .
                                        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                        .m_data;
                              lVar63 = (pCStack_12bf8->
                                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                       ).m_stride.m_outer.m_value;
                              pMVar73 = (MatrixNx6 *)0x0;
                              TVar75.m_matrix = local_c680.m_matrix;
                              do {
                                if (0 < lVar62) {
                                  lVar72 = 0;
                                  pMVar77 = TVar75.m_matrix;
                                  do {
                                    pdVar69[lVar72] =
                                         (double)(pMVar77->
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                 ).m_storage.m_data;
                                    lVar72 = lVar72 + 1;
                                    pMVar77 = (Matrix<double,__1,__1,_1,__1,__1> *)
                                              (&(pMVar77->
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                ).m_storage.m_data + (long)pMStack_c678);
                                  } while (lVar62 != lVar72);
                                }
                                pMVar73 = (MatrixNx6 *)
                                          ((long)(pMVar73->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_32,_6,_1,_32,_6>_>
                                                 ).m_storage.m_data.array + 1);
                                TVar75.m_matrix =
                                     (non_const_type)
                                     &((TVar75.m_matrix)->
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                      ).m_storage.m_rows;
                                pdVar69 = pdVar69 + lVar63;
                              } while (pMVar73 != pMVar48);
                            }
                            if (local_c680.m_matrix != (Matrix<double,__1,__1,_1,__1,__1> *)0x0) {
                              free(*(void **)((long)(local_c680.m_matrix + -1) + 0x10));
                            }
                            auVar84 = vmulpd_avx512f(auStack_11cc0,auStack_10ac0);
                            auVar85 = vmulpd_avx512f(auStack_116c0,auStack_104c0);
                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                            auVar85 = vmulpd_avx512f(auStack_110c0,local_fec0);
                            _auStack_12bc0 = vaddpd_avx512f(auVar84,auVar85);
                            auVar84 = vmulpd_avx512f(auStack_11c80,auStack_10a80);
                            auVar85 = vmulpd_avx512f(auStack_11680,auStack_10480);
                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                            auVar85 = vmulpd_avx512f(auStack_11080,local_fe80);
                            auStack_12b80 = vaddpd_avx512f(auVar84,auVar85);
                            auVar84 = vmulpd_avx512f(auStack_11c40,auStack_10a40);
                            auVar85 = vmulpd_avx512f(auStack_11640,auStack_10440);
                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                            auVar85 = vmulpd_avx512f(auStack_11040,local_fe40);
                            auStack_12b40 = vaddpd_avx512f(auVar84,auVar85);
                            auVar84 = vmulpd_avx512f(auStack_11c00,auStack_10a00);
                            auVar85 = vmulpd_avx512f(auStack_11600,auStack_10400);
                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                            auVar85 = vmulpd_avx512f(auStack_11000,local_fe00);
                            auStack_12b00 = vaddpd_avx512f(auVar84,auVar85);
                            auVar84 = vmulpd_avx512f(auStack_11bc0,auStack_109c0);
                            auVar85 = vmulpd_avx512f(auStack_115c0,auStack_103c0);
                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                            auVar85 = vmulpd_avx512f(auStack_10fc0,local_fdc0);
                            auStack_12ac0 = vaddpd_avx512f(auVar84,auVar85);
                            auVar84 = vmulpd_avx512f(auStack_11b80,auStack_10980);
                            auVar85 = vmulpd_avx512f(auStack_11580,auStack_10380);
                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                            auVar85 = vmulpd_avx512f(auStack_10f80,local_fd80);
                            auStack_12a80 = vaddpd_avx512f(auVar84,auVar85);
                            auVar84 = vmulpd_avx512f(auStack_11b40,auStack_10940);
                            auVar85 = vmulpd_avx512f(auStack_11540,auStack_10340);
                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                            auVar85 = vmulpd_avx512f(auStack_10f40,local_fd40);
                            auStack_12a40 = vaddpd_avx512f(auVar84,auVar85);
                            auVar84 = vmulpd_avx512f(auStack_11b00,auStack_10900);
                            auVar85 = vmulpd_avx512f(auStack_11500,auStack_10300);
                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                            auVar85 = vmulpd_avx512f(auStack_10f00,local_fd00);
                            auStack_12a00 = vaddpd_avx512f(auVar84,auVar85);
                            auVar84 = vmulpd_avx512f(auStack_11cc0,auStack_11cc0);
                            auVar85 = vmulpd_avx512f(auStack_116c0,auStack_116c0);
                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                            auVar85 = vmulpd_avx512f(auStack_110c0,auStack_110c0);
                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                            auVar85 = vmulpd_avx512f(auStack_11c80,auStack_11c80);
                            auVar86 = vmulpd_avx512f(auStack_11680,auStack_11680);
                            auVar85 = vaddpd_avx512f(auVar85,auVar86);
                            auVar86 = vmulpd_avx512f(auStack_11080,auStack_11080);
                            auVar85 = vaddpd_avx512f(auVar85,auVar86);
                            auVar86 = vmulpd_avx512f(auStack_11c40,auStack_11c40);
                            auVar87 = vmulpd_avx512f(auStack_11640,auStack_11640);
                            auVar86 = vaddpd_avx512f(auVar86,auVar87);
                            auVar87 = vmulpd_avx512f(auStack_11040,auStack_11040);
                            auVar86 = vaddpd_avx512f(auVar86,auVar87);
                            auVar87 = vmulpd_avx512f(auStack_11c00,auStack_11c00);
                            auVar88 = vmulpd_avx512f(auStack_11600,auStack_11600);
                            auVar87 = vaddpd_avx512f(auVar87,auVar88);
                            auVar88 = vmulpd_avx512f(auStack_11000,auStack_11000);
                            auVar87 = vaddpd_avx512f(auVar87,auVar88);
                            auVar88 = vmulpd_avx512f(auStack_11bc0,auStack_11bc0);
                            auVar89 = vmulpd_avx512f(auStack_115c0,auStack_115c0);
                            auVar88 = vaddpd_avx512f(auVar88,auVar89);
                            auVar89 = vmulpd_avx512f(auStack_10fc0,auStack_10fc0);
                            auVar88 = vaddpd_avx512f(auVar88,auVar89);
                            auVar89 = vmulpd_avx512f(auStack_11b80,auStack_11b80);
                            auVar90 = vmulpd_avx512f(auStack_11580,auStack_11580);
                            auVar89 = vaddpd_avx512f(auVar89,auVar90);
                            auVar90 = vmulpd_avx512f(auStack_10f80,auStack_10f80);
                            auVar89 = vaddpd_avx512f(auVar89,auVar90);
                            auVar90 = vmulpd_avx512f(auStack_11b40,auStack_11b40);
                            auVar91 = vmulpd_avx512f(auStack_11540,auStack_11540);
                            auVar90 = vaddpd_avx512f(auVar90,auVar91);
                            auVar91 = vmulpd_avx512f(auStack_10f40,auStack_10f40);
                            auVar90 = vaddpd_avx512f(auVar90,auVar91);
                            auVar91 = vmulpd_avx512f(auStack_11b00,auStack_11b00);
                            auVar92 = vmulpd_avx512f(auStack_11500,auStack_11500);
                            auVar91 = vaddpd_avx512f(auVar91,auVar92);
                            auVar92 = vmulpd_avx512f(auStack_10f00,auStack_10f00);
                            auVar91 = vaddpd_avx512f(auVar91,auVar92);
                            auVar92 = vbroadcastsd_avx512f(ZEXT816(0xbff0000000000000));
                            auVar84 = vaddpd_avx512f(auVar92,auVar84);
                            auVar85 = vaddpd_avx512f(auVar92,auVar85);
                            auVar86 = vaddpd_avx512f(auVar92,auVar86);
                            auVar87 = vaddpd_avx512f(auVar92,auVar87);
                            auVar88 = vaddpd_avx512f(auVar92,auVar88);
                            auVar89 = vaddpd_avx512f(auVar92,auVar89);
                            auVar90 = vaddpd_avx512f(auVar90,auVar92);
                            auVar91 = vaddpd_avx512f(auVar91,auVar92);
                            auVar93 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
                            auVar84 = vmulpd_avx512f(auVar84,auVar93);
                            auVar85 = vmulpd_avx512f(auVar85,auVar93);
                            auVar86 = vmulpd_avx512f(auVar86,auVar93);
                            auVar87 = vmulpd_avx512f(auVar87,auVar93);
                            auVar88 = vmulpd_avx512f(auVar88,auVar93);
                            auVar89 = vmulpd_avx512f(auVar89,auVar93);
                            auVar90 = vmulpd_avx512f(auVar90,auVar93);
                            auVar91 = vmulpd_avx512f(auVar91,auVar93);
                            auVar3._8_8_ = 0;
                            auVar3._0_8_ = this->m_Alpha;
                            auVar94 = vbroadcastsd_avx512f(auVar3);
                            auVar95 = vmulpd_avx512f(auVar94,_auStack_12bc0);
                            auStack_129c0 = vaddpd_avx512f(auVar84,auVar95);
                            auVar84 = vmulpd_avx512f(auVar94,auStack_12b80);
                            auStack_12980 = vaddpd_avx512f(auVar85,auVar84);
                            auVar84 = vmulpd_avx512f(auVar94,auStack_12b40);
                            auStack_12940 = vaddpd_avx512f(auVar86,auVar84);
                            auVar84 = vmulpd_avx512f(auVar94,auStack_12b00);
                            auStack_12900 = vaddpd_avx512f(auVar84,auVar87);
                            auVar84 = vmulpd_avx512f(auVar94,auStack_12ac0);
                            auStack_128c0 = vaddpd_avx512f(auVar84,auVar88);
                            auVar84 = vmulpd_avx512f(auVar94,auStack_12a80);
                            auStack_12880 = vaddpd_avx512f(auVar84,auVar89);
                            auVar84 = vmulpd_avx512f(auVar94,auStack_12a40);
                            auStack_12840 = vaddpd_avx512f(auVar84,auVar90);
                            auVar84 = vmulpd_avx512f(auVar94,auStack_12a00);
                            auStack_12800 = vaddpd_avx512f(auVar84,auVar91);
                            if (((this->m_kGQ).
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                 m_storage.m_rows == 0x40) &&
                               ((this->m_kGQ).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols == 1)) {
                              pauVar70 = (undefined1 (*) [64])
                                         (this->m_kGQ).
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                         .m_storage.m_data;
                              auStack_129c0 = vmulpd_avx512f(*pauVar70,auStack_129c0);
                              auStack_12980 = vmulpd_avx512f(pauVar70[1],auStack_12980);
                              auStack_12940 = vmulpd_avx512f(pauVar70[2],auStack_12940);
                              auStack_12900 = vmulpd_avx512f(pauVar70[3],auStack_12900);
                              auStack_128c0 = vmulpd_avx512f(pauVar70[4],auStack_128c0);
                              auStack_12880 = vmulpd_avx512f(pauVar70[5],auStack_12880);
                              auStack_12840 = vmulpd_avx512f(pauVar70[6],auStack_12840);
                              auStack_12800 = vmulpd_avx512f(pauVar70[7],auStack_12800);
                              auVar84 = vmulpd_avx512f(auStack_11ac0,auStack_108c0);
                              auVar85 = vmulpd_avx512f(auStack_114c0,auStack_102c0);
                              auVar84 = vaddpd_avx512f(auVar84,auVar85);
                              auVar85 = vmulpd_avx512f(auStack_10ec0,local_fcc0);
                              _auStack_12bc0 = vaddpd_avx512f(auVar84,auVar85);
                              auVar84 = vmulpd_avx512f(auStack_11a80,auStack_10880);
                              auVar85 = vmulpd_avx512f(auStack_11480,auStack_10280);
                              auVar84 = vaddpd_avx512f(auVar84,auVar85);
                              auVar85 = vmulpd_avx512f(auStack_10e80,local_fc80);
                              auStack_12b80 = vaddpd_avx512f(auVar84,auVar85);
                              auVar84 = vmulpd_avx512f(auStack_11a40,auStack_10840);
                              auVar85 = vmulpd_avx512f(auStack_11440,auStack_10240);
                              auVar84 = vaddpd_avx512f(auVar84,auVar85);
                              auVar85 = vmulpd_avx512f(auStack_10e40,local_fc40);
                              auStack_12b40 = vaddpd_avx512f(auVar84,auVar85);
                              auVar84 = vmulpd_avx512f(auStack_11a00,auStack_10800);
                              auVar85 = vmulpd_avx512f(auStack_11400,auStack_10200);
                              auVar84 = vaddpd_avx512f(auVar84,auVar85);
                              auVar85 = vmulpd_avx512f(auStack_10e00,local_fc00);
                              auStack_12b00 = vaddpd_avx512f(auVar84,auVar85);
                              auVar84 = vmulpd_avx512f(auStack_119c0,auStack_107c0);
                              auVar85 = vmulpd_avx512f(auStack_113c0,auStack_101c0);
                              auVar84 = vaddpd_avx512f(auVar84,auVar85);
                              auVar85 = vmulpd_avx512f(auStack_10dc0,local_fbc0);
                              auStack_12ac0 = vaddpd_avx512f(auVar84,auVar85);
                              auVar84 = vmulpd_avx512f(auStack_11980,auStack_10780);
                              auVar85 = vmulpd_avx512f(auStack_11380,auStack_10180);
                              auVar84 = vaddpd_avx512f(auVar84,auVar85);
                              auVar85 = vmulpd_avx512f(auStack_10d80,local_fb80);
                              auStack_12a80 = vaddpd_avx512f(auVar84,auVar85);
                              auVar84 = vmulpd_avx512f(auStack_11940,auStack_10740);
                              auVar85 = vmulpd_avx512f(auStack_11340,auStack_10140);
                              auVar84 = vaddpd_avx512f(auVar84,auVar85);
                              auVar85 = vmulpd_avx512f(auStack_10d40,local_fb40);
                              auStack_12a40 = vaddpd_avx512f(auVar84,auVar85);
                              auVar84 = vmulpd_avx512f(auStack_11900,auStack_10700);
                              auVar85 = vmulpd_avx512f(auStack_11300,auStack_10100);
                              auVar84 = vaddpd_avx512f(auVar84,auVar85);
                              auVar85 = vmulpd_avx512f(auStack_10d00,local_fb00);
                              auStack_12a00 = vaddpd_avx512f(auVar84,auVar85);
                              auVar84 = vmulpd_avx512f(auStack_11ac0,auStack_11ac0);
                              auVar85 = vmulpd_avx512f(auStack_114c0,auStack_114c0);
                              auVar84 = vaddpd_avx512f(auVar84,auVar85);
                              auVar85 = vmulpd_avx512f(auStack_10ec0,auStack_10ec0);
                              auVar84 = vaddpd_avx512f(auVar84,auVar85);
                              auVar85 = vmulpd_avx512f(auStack_11a80,auStack_11a80);
                              auVar86 = vmulpd_avx512f(auStack_11480,auStack_11480);
                              auVar85 = vaddpd_avx512f(auVar85,auVar86);
                              auVar86 = vmulpd_avx512f(auStack_10e80,auStack_10e80);
                              auVar85 = vaddpd_avx512f(auVar85,auVar86);
                              auVar86 = vmulpd_avx512f(auStack_11a40,auStack_11a40);
                              auVar87 = vmulpd_avx512f(auStack_11440,auStack_11440);
                              auVar86 = vaddpd_avx512f(auVar86,auVar87);
                              auVar87 = vmulpd_avx512f(auStack_10e40,auStack_10e40);
                              auVar86 = vaddpd_avx512f(auVar86,auVar87);
                              auVar87 = vmulpd_avx512f(auStack_11a00,auStack_11a00);
                              auVar88 = vmulpd_avx512f(auStack_11400,auStack_11400);
                              auVar87 = vaddpd_avx512f(auVar87,auVar88);
                              auVar88 = vmulpd_avx512f(auStack_10e00,auStack_10e00);
                              auVar87 = vaddpd_avx512f(auVar87,auVar88);
                              auVar88 = vmulpd_avx512f(auStack_119c0,auStack_119c0);
                              auVar89 = vmulpd_avx512f(auStack_113c0,auStack_113c0);
                              auVar88 = vaddpd_avx512f(auVar88,auVar89);
                              auVar89 = vmulpd_avx512f(auStack_10dc0,auStack_10dc0);
                              auVar88 = vaddpd_avx512f(auVar88,auVar89);
                              auVar89 = vmulpd_avx512f(auStack_11980,auStack_11980);
                              auVar90 = vmulpd_avx512f(auStack_11380,auStack_11380);
                              auVar89 = vaddpd_avx512f(auVar89,auVar90);
                              auVar90 = vmulpd_avx512f(auStack_10d80,auStack_10d80);
                              auVar89 = vaddpd_avx512f(auVar89,auVar90);
                              auVar90 = vmulpd_avx512f(auStack_11940,auStack_11940);
                              auVar91 = vmulpd_avx512f(auStack_11340,auStack_11340);
                              auVar90 = vaddpd_avx512f(auVar90,auVar91);
                              auVar91 = vmulpd_avx512f(auStack_10d40,auStack_10d40);
                              auVar90 = vaddpd_avx512f(auVar90,auVar91);
                              auVar91 = vmulpd_avx512f(auStack_11900,auStack_11900);
                              auVar94 = vmulpd_avx512f(auStack_11300,auStack_11300);
                              auVar91 = vaddpd_avx512f(auVar91,auVar94);
                              auVar94 = vmulpd_avx512f(auStack_10d00,auStack_10d00);
                              auVar91 = vaddpd_avx512f(auVar91,auVar94);
                              auVar84 = vaddpd_avx512f(auVar92,auVar84);
                              auVar85 = vaddpd_avx512f(auVar92,auVar85);
                              auVar86 = vaddpd_avx512f(auVar92,auVar86);
                              auVar87 = vaddpd_avx512f(auVar92,auVar87);
                              auVar88 = vaddpd_avx512f(auVar92,auVar88);
                              auVar89 = vaddpd_avx512f(auVar92,auVar89);
                              auVar90 = vaddpd_avx512f(auVar90,auVar92);
                              auVar91 = vaddpd_avx512f(auVar91,auVar92);
                              auVar84 = vmulpd_avx512f(auVar84,auVar93);
                              auVar85 = vmulpd_avx512f(auVar85,auVar93);
                              auVar86 = vmulpd_avx512f(auVar86,auVar93);
                              auVar87 = vmulpd_avx512f(auVar87,auVar93);
                              auVar88 = vmulpd_avx512f(auVar88,auVar93);
                              auVar89 = vmulpd_avx512f(auVar89,auVar93);
                              auVar90 = vmulpd_avx512f(auVar90,auVar93);
                              auVar91 = vmulpd_avx512f(auVar91,auVar93);
                              auVar4._8_8_ = 0;
                              auVar4._0_8_ = this->m_Alpha;
                              auVar94 = vbroadcastsd_avx512f(auVar4);
                              auVar95 = vmulpd_avx512f(auVar94,_auStack_12bc0);
                              auStack_127c0 = vaddpd_avx512f(auVar84,auVar95);
                              auVar84 = vmulpd_avx512f(auVar94,auStack_12b80);
                              auStack_12780 = vaddpd_avx512f(auVar85,auVar84);
                              auVar84 = vmulpd_avx512f(auVar94,auStack_12b40);
                              auStack_12740 = vaddpd_avx512f(auVar86,auVar84);
                              auVar84 = vmulpd_avx512f(auVar94,auStack_12b00);
                              auStack_12700 = vaddpd_avx512f(auVar84,auVar87);
                              auVar84 = vmulpd_avx512f(auVar94,auStack_12ac0);
                              auStack_126c0 = vaddpd_avx512f(auVar84,auVar88);
                              auVar84 = vmulpd_avx512f(auVar94,auStack_12a80);
                              auStack_12680 = vaddpd_avx512f(auVar84,auVar89);
                              auVar84 = vmulpd_avx512f(auVar94,auStack_12a40);
                              auStack_12640 = vaddpd_avx512f(auVar84,auVar90);
                              auVar84 = vmulpd_avx512f(auVar94,auStack_12a00);
                              auStack_12600 = vaddpd_avx512f(auVar84,auVar91);
                              if (((this->m_kGQ).
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_rows == 0x40) &&
                                 ((this->m_kGQ).
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols == 1)) {
                                pauVar70 = (undefined1 (*) [64])
                                           (this->m_kGQ).
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                           .m_storage.m_data;
                                auStack_127c0 = vmulpd_avx512f(*pauVar70,auStack_127c0);
                                auStack_12780 = vmulpd_avx512f(pauVar70[1],auStack_12780);
                                auStack_12740 = vmulpd_avx512f(pauVar70[2],auStack_12740);
                                auStack_12700 = vmulpd_avx512f(pauVar70[3],auStack_12700);
                                auStack_126c0 = vmulpd_avx512f(pauVar70[4],auStack_126c0);
                                auStack_12680 = vmulpd_avx512f(pauVar70[5],auStack_12680);
                                auStack_12640 = vmulpd_avx512f(pauVar70[6],auStack_12640);
                                auStack_12600 = vmulpd_avx512f(pauVar70[7],auStack_12600);
                                auVar84 = vmulpd_avx512f(auStack_118c0,auStack_106c0);
                                auVar85 = vmulpd_avx512f(auStack_112c0,auStack_100c0);
                                auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                auVar85 = vmulpd_avx512f(auStack_10cc0,local_fac0);
                                _auStack_12bc0 = vaddpd_avx512f(auVar84,auVar85);
                                auVar84 = vmulpd_avx512f(auStack_11880,auStack_10680);
                                auVar85 = vmulpd_avx512f(auStack_11280,auStack_10080);
                                auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                auVar85 = vmulpd_avx512f(auStack_10c80,local_fa80);
                                auStack_12b80 = vaddpd_avx512f(auVar84,auVar85);
                                auVar84 = vmulpd_avx512f(auStack_11840,auStack_10640);
                                auVar85 = vmulpd_avx512f(auStack_11240,auStack_10040);
                                auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                auVar85 = vmulpd_avx512f(auStack_10c40,local_fa40);
                                auStack_12b40 = vaddpd_avx512f(auVar84,auVar85);
                                auVar84 = vmulpd_avx512f(auStack_11800,auStack_10600);
                                auVar85 = vmulpd_avx512f(auStack_11200,local_10000);
                                auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                auVar85 = vmulpd_avx512f(auStack_10c00,local_fa00);
                                auStack_12b00 = vaddpd_avx512f(auVar84,auVar85);
                                auVar84 = vmulpd_avx512f(auStack_117c0,auStack_105c0);
                                auVar85 = vmulpd_avx512f(auStack_111c0,local_ffc0);
                                auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                auVar85 = vmulpd_avx512f(auStack_10bc0,local_f9c0);
                                auStack_12ac0 = vaddpd_avx512f(auVar84,auVar85);
                                auVar84 = vmulpd_avx512f(auStack_11780,auStack_10580);
                                auVar85 = vmulpd_avx512f(auStack_11180,local_ff80);
                                auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                auVar85 = vmulpd_avx512f(auStack_10b80,local_f980);
                                auStack_12a80 = vaddpd_avx512f(auVar84,auVar85);
                                auVar84 = vmulpd_avx512f(auStack_11740,auStack_10540);
                                auVar85 = vmulpd_avx512f(auStack_11140,local_ff40);
                                auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                auVar85 = vmulpd_avx512f(auStack_10b40,local_f940);
                                auStack_12a40 = vaddpd_avx512f(auVar84,auVar85);
                                auVar84 = vmulpd_avx512f(auStack_11700,auStack_10500);
                                auVar85 = vmulpd_avx512f(auStack_11100,local_ff00);
                                auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                auVar85 = vmulpd_avx512f(auStack_10b00,local_f900);
                                auStack_12a00 = vaddpd_avx512f(auVar84,auVar85);
                                auVar84 = vmulpd_avx512f(auStack_118c0,auStack_118c0);
                                auVar85 = vmulpd_avx512f(auStack_112c0,auStack_112c0);
                                auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                auVar85 = vmulpd_avx512f(auStack_10cc0,auStack_10cc0);
                                auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                auVar85 = vmulpd_avx512f(auStack_11880,auStack_11880);
                                auVar86 = vmulpd_avx512f(auStack_11280,auStack_11280);
                                auVar85 = vaddpd_avx512f(auVar85,auVar86);
                                auVar86 = vmulpd_avx512f(auStack_10c80,auStack_10c80);
                                auVar85 = vaddpd_avx512f(auVar85,auVar86);
                                auVar86 = vmulpd_avx512f(auStack_11840,auStack_11840);
                                auVar87 = vmulpd_avx512f(auStack_11240,auStack_11240);
                                auVar86 = vaddpd_avx512f(auVar86,auVar87);
                                auVar87 = vmulpd_avx512f(auStack_10c40,auStack_10c40);
                                auVar86 = vaddpd_avx512f(auVar86,auVar87);
                                auVar87 = vmulpd_avx512f(auStack_11800,auStack_11800);
                                auVar88 = vmulpd_avx512f(auStack_11200,auStack_11200);
                                auVar87 = vaddpd_avx512f(auVar87,auVar88);
                                auVar88 = vmulpd_avx512f(auStack_10c00,auStack_10c00);
                                auVar87 = vaddpd_avx512f(auVar87,auVar88);
                                auVar88 = vmulpd_avx512f(auStack_117c0,auStack_117c0);
                                auVar89 = vmulpd_avx512f(auStack_111c0,auStack_111c0);
                                auVar88 = vaddpd_avx512f(auVar88,auVar89);
                                auVar89 = vmulpd_avx512f(auStack_10bc0,auStack_10bc0);
                                auVar88 = vaddpd_avx512f(auVar88,auVar89);
                                auVar89 = vmulpd_avx512f(auStack_11780,auStack_11780);
                                auVar90 = vmulpd_avx512f(auStack_11180,auStack_11180);
                                auVar89 = vaddpd_avx512f(auVar89,auVar90);
                                auVar90 = vmulpd_avx512f(auStack_10b80,auStack_10b80);
                                auVar89 = vaddpd_avx512f(auVar89,auVar90);
                                auVar90 = vmulpd_avx512f(auStack_11740,auStack_11740);
                                auVar91 = vmulpd_avx512f(auStack_11140,auStack_11140);
                                auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                auVar91 = vmulpd_avx512f(auStack_10b40,auStack_10b40);
                                auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                auVar91 = vmulpd_avx512f(auStack_11700,auStack_11700);
                                auVar94 = vmulpd_avx512f(auStack_11100,auStack_11100);
                                auVar91 = vaddpd_avx512f(auVar91,auVar94);
                                auVar94 = vmulpd_avx512f(auStack_10b00,auStack_10b00);
                                auVar91 = vaddpd_avx512f(auVar91,auVar94);
                                auVar84 = vaddpd_avx512f(auVar92,auVar84);
                                auVar85 = vaddpd_avx512f(auVar92,auVar85);
                                auVar86 = vaddpd_avx512f(auVar92,auVar86);
                                auVar87 = vaddpd_avx512f(auVar92,auVar87);
                                auVar88 = vaddpd_avx512f(auVar92,auVar88);
                                auVar89 = vaddpd_avx512f(auVar92,auVar89);
                                auVar90 = vaddpd_avx512f(auVar90,auVar92);
                                auVar91 = vaddpd_avx512f(auVar91,auVar92);
                                auVar84 = vmulpd_avx512f(auVar84,auVar93);
                                auVar85 = vmulpd_avx512f(auVar85,auVar93);
                                auVar86 = vmulpd_avx512f(auVar86,auVar93);
                                auVar87 = vmulpd_avx512f(auVar87,auVar93);
                                auVar88 = vmulpd_avx512f(auVar88,auVar93);
                                auVar89 = vmulpd_avx512f(auVar89,auVar93);
                                auVar90 = vmulpd_avx512f(auVar90,auVar93);
                                auVar91 = vmulpd_avx512f(auVar91,auVar93);
                                auVar5._8_8_ = 0;
                                auVar5._0_8_ = this->m_Alpha;
                                auVar92 = vbroadcastsd_avx512f(auVar5);
                                auVar93 = vmulpd_avx512f(auVar92,_auStack_12bc0);
                                auStack_12580 = vaddpd_avx512f(auVar84,auVar93);
                                auVar84 = vmulpd_avx512f(auVar92,auStack_12b80);
                                auStack_12540 = vaddpd_avx512f(auVar85,auVar84);
                                auVar84 = vmulpd_avx512f(auVar92,auStack_12b40);
                                auStack_12500 = vaddpd_avx512f(auVar86,auVar84);
                                auVar84 = vmulpd_avx512f(auVar92,auStack_12b00);
                                auStack_124c0 = vaddpd_avx512f(auVar84,auVar87);
                                auVar84 = vmulpd_avx512f(auVar92,auStack_12ac0);
                                auStack_12480 = vaddpd_avx512f(auVar84,auVar88);
                                auVar84 = vmulpd_avx512f(auVar92,auStack_12a80);
                                auStack_12440 = vaddpd_avx512f(auVar84,auVar89);
                                auVar84 = vmulpd_avx512f(auVar92,auStack_12a40);
                                auStack_12400 = vaddpd_avx512f(auVar84,auVar90);
                                auVar84 = vmulpd_avx512f(auVar92,auStack_12a00);
                                auStack_123c0 = vaddpd_avx512f(auVar84,auVar91);
                                if (((this->m_kGQ).
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_rows == 0x40) &&
                                   ((this->m_kGQ).
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_cols == 1)) {
                                  pauVar70 = (undefined1 (*) [64])
                                             (this->m_kGQ).
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                             .m_storage.m_data;
                                  auStack_12580 = vmulpd_avx512f(*pauVar70,auStack_12580);
                                  auStack_12540 = vmulpd_avx512f(pauVar70[1],auStack_12540);
                                  auStack_12500 = vmulpd_avx512f(pauVar70[2],auStack_12500);
                                  auStack_124c0 = vmulpd_avx512f(pauVar70[3],auStack_124c0);
                                  auStack_12480 = vmulpd_avx512f(pauVar70[4],auStack_12480);
                                  auStack_12440 = vmulpd_avx512f(pauVar70[5],auStack_12440);
                                  auStack_12400 = vmulpd_avx512f(pauVar70[6],auStack_12400);
                                  auStack_123c0 = vmulpd_avx512f(pauVar70[7],auStack_123c0);
                                  uVar67 = 0xfffffffffffffff8;
                                  do {
                                    auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                              (auStack_11880 + uVar67 * 8),
                                                             *(undefined1 (*) [64])
                                                              (auStack_10880 + uVar67 * 8));
                                    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                              (auStack_11280 + uVar67 * 8),
                                                             *(undefined1 (*) [64])
                                                              (auStack_10280 + uVar67 * 8));
                                    auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                              (auStack_10c80 + uVar67 * 8),
                                                             *(undefined1 (*) [64])
                                                              (local_fc80 + uVar67 * 8));
                                    auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                              (auStack_11a80 + uVar67 * 8),
                                                             *(undefined1 (*) [64])
                                                              (auStack_10680 + uVar67 * 8));
                                    auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                              (auStack_11480 + uVar67 * 8),
                                                             *(undefined1 (*) [64])
                                                              (auStack_10080 + uVar67 * 8));
                                    auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                    auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                              (auStack_10e80 + uVar67 * 8),
                                                             *(undefined1 (*) [64])
                                                              (local_fa80 + uVar67 * 8));
                                    auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                    *(undefined1 (*) [64])(auStack_12b80 + uVar67 * 8) = auVar84;
                                    uVar67 = uVar67 + 8;
                                  } while (uVar67 < 0x38);
                                  auVar84 = vmulpd_avx512f(auStack_11ac0,auStack_118c0);
                                  auVar85 = vmulpd_avx512f(auStack_114c0,auStack_112c0);
                                  auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                  auVar85 = vmulpd_avx512f(auStack_10ec0,auStack_10cc0);
                                  auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                  auVar85 = vmulpd_avx512f(auStack_11a80,auStack_11880);
                                  auVar86 = vmulpd_avx512f(auStack_11480,auStack_11280);
                                  auVar85 = vaddpd_avx512f(auVar85,auVar86);
                                  auVar86 = vmulpd_avx512f(auStack_10e80,auStack_10c80);
                                  auVar85 = vaddpd_avx512f(auVar85,auVar86);
                                  auVar86 = vmulpd_avx512f(auStack_11a40,auStack_11840);
                                  auVar87 = vmulpd_avx512f(auStack_11440,auStack_11240);
                                  auVar86 = vaddpd_avx512f(auVar86,auVar87);
                                  auVar87 = vmulpd_avx512f(auStack_10e40,auStack_10c40);
                                  auVar86 = vaddpd_avx512f(auVar86,auVar87);
                                  auVar87 = vmulpd_avx512f(auStack_11a00,auStack_11800);
                                  auVar88 = vmulpd_avx512f(auStack_11400,auStack_11200);
                                  auVar87 = vaddpd_avx512f(auVar87,auVar88);
                                  auVar88 = vmulpd_avx512f(auStack_10e00,auStack_10c00);
                                  auVar87 = vaddpd_avx512f(auVar87,auVar88);
                                  auVar88 = vmulpd_avx512f(auStack_119c0,auStack_117c0);
                                  auVar89 = vmulpd_avx512f(auStack_113c0,auStack_111c0);
                                  auVar88 = vaddpd_avx512f(auVar88,auVar89);
                                  auVar89 = vmulpd_avx512f(auStack_10dc0,auStack_10bc0);
                                  auVar88 = vaddpd_avx512f(auVar88,auVar89);
                                  auVar89 = vmulpd_avx512f(auStack_11980,auStack_11780);
                                  auVar90 = vmulpd_avx512f(auStack_11380,auStack_11180);
                                  auVar89 = vaddpd_avx512f(auVar89,auVar90);
                                  auVar90 = vmulpd_avx512f(auStack_10d80,auStack_10b80);
                                  auVar89 = vaddpd_avx512f(auVar89,auVar90);
                                  auVar90 = vmulpd_avx512f(auStack_11940,auStack_11740);
                                  auVar91 = vmulpd_avx512f(auStack_11340,auStack_11140);
                                  auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                  auVar91 = vmulpd_avx512f(auStack_10d40,auStack_10b40);
                                  auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                  auVar91 = vmulpd_avx512f(auStack_11900,auStack_11700);
                                  auVar92 = vmulpd_avx512f(auStack_11300,auStack_11100);
                                  auVar91 = vaddpd_avx512f(auVar91,auVar92);
                                  auVar92 = vmulpd_avx512f(auStack_10d00,auStack_10b00);
                                  auVar91 = vaddpd_avx512f(auVar91,auVar92);
                                  auVar6._8_8_ = 0;
                                  auVar6._0_8_ = this->m_Alpha;
                                  auVar92 = vbroadcastsd_avx512f(auVar6);
                                  auVar93 = vmulpd_avx512f(auVar92,_auStack_12bc0);
                                  auStack_11f40 = vaddpd_avx512f(auVar93,auVar84);
                                  auVar84 = vmulpd_avx512f(auVar92,auStack_12b80);
                                  auStack_11f00 = vaddpd_avx512f(auVar84,auVar85);
                                  auVar84 = vmulpd_avx512f(auVar92,auStack_12b40);
                                  auStack_11ec0 = vaddpd_avx512f(auVar84,auVar86);
                                  auVar84 = vmulpd_avx512f(auVar92,auStack_12b00);
                                  auStack_11e80 = vaddpd_avx512f(auVar84,auVar87);
                                  auVar84 = vmulpd_avx512f(auVar92,auStack_12ac0);
                                  auStack_11e40 = vaddpd_avx512f(auVar84,auVar88);
                                  auVar84 = vmulpd_avx512f(auVar92,auStack_12a80);
                                  auStack_11e00 = vaddpd_avx512f(auVar84,auVar89);
                                  auVar84 = vmulpd_avx512f(auVar92,auStack_12a40);
                                  auStack_11dc0 = vaddpd_avx512f(auVar84,auVar90);
                                  auVar84 = vmulpd_avx512f(auVar92,auStack_12a00);
                                  auStack_11d80 = vaddpd_avx512f(auVar84,auVar91);
                                  if (((this->m_kGQ).
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                       .m_storage.m_rows == 0x40) &&
                                     ((this->m_kGQ).
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                      .m_storage.m_cols == 1)) {
                                    pauVar70 = (undefined1 (*) [64])
                                               (this->m_kGQ).
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                               .m_storage.m_data;
                                    auStack_11f40 = vmulpd_avx512f(*pauVar70,auStack_11f40);
                                    auStack_11f00 = vmulpd_avx512f(pauVar70[1],auStack_11f00);
                                    auStack_11ec0 = vmulpd_avx512f(pauVar70[2],auStack_11ec0);
                                    auStack_11e80 = vmulpd_avx512f(pauVar70[3],auStack_11e80);
                                    auStack_11e40 = vmulpd_avx512f(pauVar70[4],auStack_11e40);
                                    auStack_11e00 = vmulpd_avx512f(pauVar70[5],auStack_11e00);
                                    auStack_11dc0 = vmulpd_avx512f(pauVar70[6],auStack_11dc0);
                                    auStack_11d80 = vmulpd_avx512f(pauVar70[7],auStack_11d80);
                                    uVar67 = 0xfffffffffffffff8;
                                    do {
                                      auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                (auStack_11880 + uVar67 * 8),
                                                               *(undefined1 (*) [64])
                                                                (auStack_10a80 + uVar67 * 8));
                                      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                (auStack_11280 + uVar67 * 8),
                                                               *(undefined1 (*) [64])
                                                                (auStack_10480 + uVar67 * 8));
                                      auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                (auStack_10c80 + uVar67 * 8),
                                                               *(undefined1 (*) [64])
                                                                (local_fe80 + uVar67 * 8));
                                      auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                (auStack_11c80 + uVar67 * 8),
                                                               *(undefined1 (*) [64])
                                                                (auStack_10680 + uVar67 * 8));
                                      auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                (auStack_11680 + uVar67 * 8),
                                                               *(undefined1 (*) [64])
                                                                (auStack_10080 + uVar67 * 8));
                                      auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                      auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                (auStack_11080 + uVar67 * 8),
                                                               *(undefined1 (*) [64])
                                                                (local_fa80 + uVar67 * 8));
                                      auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                      *(undefined1 (*) [64])(auStack_12b80 + uVar67 * 8) = auVar84;
                                      uVar67 = uVar67 + 8;
                                    } while (uVar67 < 0x38);
                                    auVar84 = vmulpd_avx512f(auStack_11cc0,auStack_118c0);
                                    auVar85 = vmulpd_avx512f(auStack_116c0,auStack_112c0);
                                    auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                    auVar85 = vmulpd_avx512f(auStack_110c0,auStack_10cc0);
                                    auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                    auVar85 = vmulpd_avx512f(auStack_11c80,auStack_11880);
                                    auVar86 = vmulpd_avx512f(auStack_11680,auStack_11280);
                                    auVar85 = vaddpd_avx512f(auVar85,auVar86);
                                    auVar86 = vmulpd_avx512f(auStack_11080,auStack_10c80);
                                    auVar85 = vaddpd_avx512f(auVar85,auVar86);
                                    auVar86 = vmulpd_avx512f(auStack_11c40,auStack_11840);
                                    auVar87 = vmulpd_avx512f(auStack_11640,auStack_11240);
                                    auVar86 = vaddpd_avx512f(auVar86,auVar87);
                                    auVar87 = vmulpd_avx512f(auStack_11040,auStack_10c40);
                                    auVar86 = vaddpd_avx512f(auVar86,auVar87);
                                    auVar87 = vmulpd_avx512f(auStack_11c00,auStack_11800);
                                    auVar88 = vmulpd_avx512f(auStack_11600,auStack_11200);
                                    auVar87 = vaddpd_avx512f(auVar87,auVar88);
                                    auVar88 = vmulpd_avx512f(auStack_11000,auStack_10c00);
                                    auVar87 = vaddpd_avx512f(auVar87,auVar88);
                                    auVar88 = vmulpd_avx512f(auStack_11bc0,auStack_117c0);
                                    auVar89 = vmulpd_avx512f(auStack_115c0,auStack_111c0);
                                    auVar88 = vaddpd_avx512f(auVar88,auVar89);
                                    auVar89 = vmulpd_avx512f(auStack_10fc0,auStack_10bc0);
                                    auVar88 = vaddpd_avx512f(auVar88,auVar89);
                                    auVar89 = vmulpd_avx512f(auStack_11b80,auStack_11780);
                                    auVar90 = vmulpd_avx512f(auStack_11580,auStack_11180);
                                    auVar89 = vaddpd_avx512f(auVar89,auVar90);
                                    auVar90 = vmulpd_avx512f(auStack_10f80,auStack_10b80);
                                    auVar89 = vaddpd_avx512f(auVar89,auVar90);
                                    auVar90 = vmulpd_avx512f(auStack_11b40,auStack_11740);
                                    auVar91 = vmulpd_avx512f(auStack_11540,auStack_11140);
                                    auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                    auVar91 = vmulpd_avx512f(auStack_10f40,auStack_10b40);
                                    auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                    auVar91 = vmulpd_avx512f(auStack_11b00,auStack_11700);
                                    auVar92 = vmulpd_avx512f(auStack_11500,auStack_11100);
                                    auVar91 = vaddpd_avx512f(auVar91,auVar92);
                                    auVar92 = vmulpd_avx512f(auStack_10f00,auStack_10b00);
                                    auVar91 = vaddpd_avx512f(auVar91,auVar92);
                                    auVar7._8_8_ = 0;
                                    auVar7._0_8_ = this->m_Alpha;
                                    auVar92 = vbroadcastsd_avx512f(auVar7);
                                    auVar93 = vmulpd_avx512f(auVar92,_auStack_12bc0);
                                    auStack_12140 = vaddpd_avx512f(auVar93,auVar84);
                                    auVar84 = vmulpd_avx512f(auVar92,auStack_12b80);
                                    auStack_12100 = vaddpd_avx512f(auVar84,auVar85);
                                    auVar84 = vmulpd_avx512f(auVar92,auStack_12b40);
                                    auStack_120c0 = vaddpd_avx512f(auVar84,auVar86);
                                    auVar84 = vmulpd_avx512f(auVar92,auStack_12b00);
                                    auStack_12080 = vaddpd_avx512f(auVar84,auVar87);
                                    auVar84 = vmulpd_avx512f(auVar92,auStack_12ac0);
                                    auStack_12040 = vaddpd_avx512f(auVar84,auVar88);
                                    auVar84 = vmulpd_avx512f(auVar92,auStack_12a80);
                                    auStack_12000 = vaddpd_avx512f(auVar84,auVar89);
                                    auVar84 = vmulpd_avx512f(auVar92,auStack_12a40);
                                    auStack_11fc0 = vaddpd_avx512f(auVar84,auVar90);
                                    auVar84 = vmulpd_avx512f(auVar92,auStack_12a00);
                                    auStack_11f80 = vaddpd_avx512f(auVar84,auVar91);
                                    if (((this->m_kGQ).
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                         .m_storage.m_rows == 0x40) &&
                                       ((this->m_kGQ).
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                        .m_storage.m_cols == 1)) {
                                      pauVar70 = (undefined1 (*) [64])
                                                 (this->m_kGQ).
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                 .m_storage.m_data;
                                      auStack_12140 = vmulpd_avx512f(*pauVar70,auStack_12140);
                                      auStack_12100 = vmulpd_avx512f(pauVar70[1],auStack_12100);
                                      auStack_120c0 = vmulpd_avx512f(pauVar70[2],auStack_120c0);
                                      auStack_12080 = vmulpd_avx512f(pauVar70[3],auStack_12080);
                                      auStack_12040 = vmulpd_avx512f(pauVar70[4],auStack_12040);
                                      auStack_12000 = vmulpd_avx512f(pauVar70[5],auStack_12000);
                                      auStack_11fc0 = vmulpd_avx512f(pauVar70[6],auStack_11fc0);
                                      auStack_11f80 = vmulpd_avx512f(pauVar70[7],auStack_11f80);
                                      uVar67 = 0xfffffffffffffff8;
                                      do {
                                        auVar84 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                  (auStack_11a80 + uVar67 * 8),
                                                                 *(undefined1 (*) [64])
                                                                  (auStack_10a80 + uVar67 * 8));
                                        auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                  (auStack_11480 + uVar67 * 8),
                                                                 *(undefined1 (*) [64])
                                                                  (auStack_10480 + uVar67 * 8));
                                        auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                        auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                  (auStack_10e80 + uVar67 * 8),
                                                                 *(undefined1 (*) [64])
                                                                  (local_fe80 + uVar67 * 8));
                                        auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                        auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                  (auStack_11c80 + uVar67 * 8),
                                                                 *(undefined1 (*) [64])
                                                                  (auStack_10880 + uVar67 * 8));
                                        auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                        auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                  (auStack_11680 + uVar67 * 8),
                                                                 *(undefined1 (*) [64])
                                                                  (auStack_10280 + uVar67 * 8));
                                        auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                        auVar85 = vmulpd_avx512f(*(undefined1 (*) [64])
                                                                  (auStack_11080 + uVar67 * 8),
                                                                 *(undefined1 (*) [64])
                                                                  (local_fc80 + uVar67 * 8));
                                        auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                        *(undefined1 (*) [64])(auStack_12b80 + uVar67 * 8) = auVar84
                                        ;
                                        uVar67 = uVar67 + 8;
                                      } while (uVar67 < 0x38);
                                      auVar84 = vmulpd_avx512f(auStack_11cc0,auStack_11ac0);
                                      auVar85 = vmulpd_avx512f(auStack_116c0,auStack_114c0);
                                      auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                      auVar85 = vmulpd_avx512f(auStack_110c0,auStack_10ec0);
                                      auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                      auVar85 = vmulpd_avx512f(auStack_11c80,auStack_11a80);
                                      auVar86 = vmulpd_avx512f(auStack_11680,auStack_11480);
                                      auVar85 = vaddpd_avx512f(auVar85,auVar86);
                                      auVar86 = vmulpd_avx512f(auStack_11080,auStack_10e80);
                                      auVar85 = vaddpd_avx512f(auVar85,auVar86);
                                      auVar86 = vmulpd_avx512f(auStack_11c40,auStack_11a40);
                                      auVar87 = vmulpd_avx512f(auStack_11640,auStack_11440);
                                      auVar86 = vaddpd_avx512f(auVar86,auVar87);
                                      auVar87 = vmulpd_avx512f(auStack_11040,auStack_10e40);
                                      auVar86 = vaddpd_avx512f(auVar86,auVar87);
                                      auVar87 = vmulpd_avx512f(auStack_11c00,auStack_11a00);
                                      auVar88 = vmulpd_avx512f(auStack_11600,auStack_11400);
                                      auVar87 = vaddpd_avx512f(auVar87,auVar88);
                                      auVar88 = vmulpd_avx512f(auStack_11000,auStack_10e00);
                                      auVar87 = vaddpd_avx512f(auVar87,auVar88);
                                      auVar88 = vmulpd_avx512f(auStack_11bc0,auStack_119c0);
                                      auVar89 = vmulpd_avx512f(auStack_115c0,auStack_113c0);
                                      auVar88 = vaddpd_avx512f(auVar88,auVar89);
                                      auVar89 = vmulpd_avx512f(auStack_10fc0,auStack_10dc0);
                                      auVar88 = vaddpd_avx512f(auVar88,auVar89);
                                      auVar89 = vmulpd_avx512f(auStack_11b80,auStack_11980);
                                      auVar90 = vmulpd_avx512f(auStack_11580,auStack_11380);
                                      auVar89 = vaddpd_avx512f(auVar89,auVar90);
                                      auVar90 = vmulpd_avx512f(auStack_10f80,auStack_10d80);
                                      auVar89 = vaddpd_avx512f(auVar89,auVar90);
                                      auVar90 = vmulpd_avx512f(auStack_11b40,auStack_11940);
                                      auVar91 = vmulpd_avx512f(auStack_11540,auStack_11340);
                                      auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                      auVar91 = vmulpd_avx512f(auStack_10f40,auStack_10d40);
                                      auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                      auVar91 = vmulpd_avx512f(auStack_11b00,auStack_11900);
                                      auVar92 = vmulpd_avx512f(auStack_11500,auStack_11300);
                                      auVar91 = vaddpd_avx512f(auVar91,auVar92);
                                      auVar92 = vmulpd_avx512f(auStack_10f00,auStack_10d00);
                                      auVar91 = vaddpd_avx512f(auVar91,auVar92);
                                      auVar8._8_8_ = 0;
                                      auVar8._0_8_ = this->m_Alpha;
                                      auVar92 = vbroadcastsd_avx512f(auVar8);
                                      auVar93 = vmulpd_avx512f(auVar92,_auStack_12bc0);
                                      auStack_12340 = vaddpd_avx512f(auVar93,auVar84);
                                      auVar84 = vmulpd_avx512f(auVar92,auStack_12b80);
                                      auStack_12300 = vaddpd_avx512f(auVar84,auVar85);
                                      auVar84 = vmulpd_avx512f(auVar92,auStack_12b40);
                                      auStack_122c0 = vaddpd_avx512f(auVar84,auVar86);
                                      auVar84 = vmulpd_avx512f(auVar92,auStack_12b00);
                                      auStack_12280 = vaddpd_avx512f(auVar84,auVar87);
                                      auVar84 = vmulpd_avx512f(auVar92,auStack_12ac0);
                                      auStack_12240 = vaddpd_avx512f(auVar84,auVar88);
                                      auVar84 = vmulpd_avx512f(auVar92,auStack_12a80);
                                      auStack_12200 = vaddpd_avx512f(auVar84,auVar89);
                                      auVar84 = vmulpd_avx512f(auVar92,auStack_12a40);
                                      auStack_121c0 = vaddpd_avx512f(auVar84,auVar90);
                                      auVar84 = vmulpd_avx512f(auVar92,auStack_12a00);
                                      auStack_12180 = vaddpd_avx512f(auVar84,auVar91);
                                      if (((this->m_kGQ).
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                           .m_storage.m_rows == 0x40) &&
                                         ((this->m_kGQ).
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          .m_storage.m_cols == 1)) {
                                        pauVar70 = (undefined1 (*) [64])
                                                   (this->m_kGQ).
                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data;
                                        auStack_12340 = vmulpd_avx512f(*pauVar70,auStack_12340);
                                        auStack_12300 = vmulpd_avx512f(pauVar70[1],auStack_12300);
                                        auStack_122c0 = vmulpd_avx512f(pauVar70[2],auStack_122c0);
                                        auStack_12280 = vmulpd_avx512f(pauVar70[3],auStack_12280);
                                        auStack_12240 = vmulpd_avx512f(pauVar70[4],auStack_12240);
                                        auStack_12200 = vmulpd_avx512f(pauVar70[5],auStack_12200);
                                        auStack_121c0 = vmulpd_avx512f(pauVar70[6],auStack_121c0);
                                        auStack_12180 = vmulpd_avx512f(pauVar70[7],auStack_12180);
                                        auVar9._8_8_ = 0;
                                        auVar9._0_8_ = (peVar47->m_D).
                                                                                                              
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                                  .m_storage.m_data.array[0];
                                        auVar84 = vbroadcastsd_avx512f(auVar9);
                                        auVar10._8_8_ = 0;
                                        auVar10._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[1];
                                        auVar85 = vbroadcastsd_avx512f(auVar10);
                                        auVar11._8_8_ = 0;
                                        auVar11._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[2];
                                        auVar86 = vbroadcastsd_avx512f(auVar11);
                                        auVar12._8_8_ = 0;
                                        auVar12._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[3];
                                        auVar87 = vbroadcastsd_avx512f(auVar12);
                                        auVar13._8_8_ = 0;
                                        auVar13._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[4];
                                        auVar88 = vbroadcastsd_avx512f(auVar13);
                                        auVar14._8_8_ = 0;
                                        auVar14._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[5];
                                        auVar89 = vbroadcastsd_avx512f(auVar14);
                                        uVar67 = 0xfffffffffffffff8;
                                        do {
                                          auVar90 = vmulpd_avx512f(auVar84,*(undefined1 (*) [64])
                                                                            (auStack_12980 +
                                                                            uVar67 * 8));
                                          auVar91 = vmulpd_avx512f(auVar85,*(undefined1 (*) [64])
                                                                            (auStack_12780 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar86,*(undefined1 (*) [64])
                                                                            (auStack_12540 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar87,*(undefined1 (*) [64])
                                                                            (auStack_11f00 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar88,*(undefined1 (*) [64])
                                                                            (auStack_12100 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar89,*(undefined1 (*) [64])
                                                                            (auStack_12300 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          *(undefined1 (*) [64])(&local_d8c0 + uVar67) = auVar90;
                                          uVar67 = uVar67 + 8;
                                        } while (uVar67 < 0x38);
                                        auVar15._8_8_ = 0;
                                        auVar15._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[6];
                                        auVar84 = vbroadcastsd_avx512f(auVar15);
                                        auVar16._8_8_ = 0;
                                        auVar16._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[7];
                                        auVar85 = vbroadcastsd_avx512f(auVar16);
                                        auVar17._8_8_ = 0;
                                        auVar17._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[8];
                                        auVar86 = vbroadcastsd_avx512f(auVar17);
                                        auVar18._8_8_ = 0;
                                        auVar18._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[9];
                                        auVar87 = vbroadcastsd_avx512f(auVar18);
                                        auVar19._8_8_ = 0;
                                        auVar19._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[10];
                                        auVar88 = vbroadcastsd_avx512f(auVar19);
                                        auVar20._8_8_ = 0;
                                        auVar20._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0xb];
                                        auVar89 = vbroadcastsd_avx512f(auVar20);
                                        uVar67 = 0xfffffffffffffff8;
                                        do {
                                          auVar90 = vmulpd_avx512f(auVar84,*(undefined1 (*) [64])
                                                                            (auStack_12980 +
                                                                            uVar67 * 8));
                                          auVar91 = vmulpd_avx512f(auVar85,*(undefined1 (*) [64])
                                                                            (auStack_12780 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar86,*(undefined1 (*) [64])
                                                                            (auStack_12540 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar87,*(undefined1 (*) [64])
                                                                            (auStack_11f00 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar88,*(undefined1 (*) [64])
                                                                            (auStack_12100 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar89,*(undefined1 (*) [64])
                                                                            (auStack_12300 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          *(undefined1 (*) [64])(&local_dac0 + uVar67) = auVar90;
                                          uVar67 = uVar67 + 8;
                                        } while (uVar67 < 0x38);
                                        auVar21._8_8_ = 0;
                                        auVar21._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0xc];
                                        auVar84 = vbroadcastsd_avx512f(auVar21);
                                        auVar22._8_8_ = 0;
                                        auVar22._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0xd];
                                        auVar85 = vbroadcastsd_avx512f(auVar22);
                                        auVar23._8_8_ = 0;
                                        auVar23._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0xe];
                                        auVar86 = vbroadcastsd_avx512f(auVar23);
                                        auVar24._8_8_ = 0;
                                        auVar24._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0xf];
                                        auVar87 = vbroadcastsd_avx512f(auVar24);
                                        auVar25._8_8_ = 0;
                                        auVar25._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x10];
                                        auVar88 = vbroadcastsd_avx512f(auVar25);
                                        auVar26._8_8_ = 0;
                                        auVar26._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x11];
                                        auVar89 = vbroadcastsd_avx512f(auVar26);
                                        uVar67 = 0xfffffffffffffff8;
                                        do {
                                          auVar90 = vmulpd_avx512f(auVar84,*(undefined1 (*) [64])
                                                                            (auStack_12980 +
                                                                            uVar67 * 8));
                                          auVar91 = vmulpd_avx512f(auVar85,*(undefined1 (*) [64])
                                                                            (auStack_12780 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar86,*(undefined1 (*) [64])
                                                                            (auStack_12540 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar87,*(undefined1 (*) [64])
                                                                            (auStack_11f00 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar88,*(undefined1 (*) [64])
                                                                            (auStack_12100 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar89,*(undefined1 (*) [64])
                                                                            (auStack_12300 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          *(undefined1 (*) [64])(&local_dcc0 + uVar67) = auVar90;
                                          uVar67 = uVar67 + 8;
                                        } while (uVar67 < 0x38);
                                        auVar27._8_8_ = 0;
                                        auVar27._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x12];
                                        auVar84 = vbroadcastsd_avx512f(auVar27);
                                        auVar28._8_8_ = 0;
                                        auVar28._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x13];
                                        auVar85 = vbroadcastsd_avx512f(auVar28);
                                        auVar29._8_8_ = 0;
                                        auVar29._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x14];
                                        auVar86 = vbroadcastsd_avx512f(auVar29);
                                        auVar30._8_8_ = 0;
                                        auVar30._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x15];
                                        auVar87 = vbroadcastsd_avx512f(auVar30);
                                        auVar31._8_8_ = 0;
                                        auVar31._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x16];
                                        auVar88 = vbroadcastsd_avx512f(auVar31);
                                        auVar32._8_8_ = 0;
                                        auVar32._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x17];
                                        auVar89 = vbroadcastsd_avx512f(auVar32);
                                        uVar67 = 0xfffffffffffffff8;
                                        do {
                                          auVar90 = vmulpd_avx512f(auVar84,*(undefined1 (*) [64])
                                                                            (auStack_12980 +
                                                                            uVar67 * 8));
                                          auVar91 = vmulpd_avx512f(auVar85,*(undefined1 (*) [64])
                                                                            (auStack_12780 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar86,*(undefined1 (*) [64])
                                                                            (auStack_12540 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar87,*(undefined1 (*) [64])
                                                                            (auStack_11f00 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar88,*(undefined1 (*) [64])
                                                                            (auStack_12100 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar89,*(undefined1 (*) [64])
                                                                            (auStack_12300 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          *(undefined1 (*) [64])(local_dec0 + uVar67 * 8) = auVar90;
                                          uVar67 = uVar67 + 8;
                                        } while (uVar67 < 0x38);
                                        auVar33._8_8_ = 0;
                                        auVar33._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x18];
                                        auVar84 = vbroadcastsd_avx512f(auVar33);
                                        auVar34._8_8_ = 0;
                                        auVar34._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x19];
                                        auVar85 = vbroadcastsd_avx512f(auVar34);
                                        auVar35._8_8_ = 0;
                                        auVar35._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x1a];
                                        auVar86 = vbroadcastsd_avx512f(auVar35);
                                        auVar36._8_8_ = 0;
                                        auVar36._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x1b];
                                        auVar87 = vbroadcastsd_avx512f(auVar36);
                                        auVar37._8_8_ = 0;
                                        auVar37._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x1c];
                                        auVar88 = vbroadcastsd_avx512f(auVar37);
                                        auVar38._8_8_ = 0;
                                        auVar38._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x1d];
                                        auVar89 = vbroadcastsd_avx512f(auVar38);
                                        uVar67 = 0xfffffffffffffff8;
                                        do {
                                          auVar90 = vmulpd_avx512f(auVar84,*(undefined1 (*) [64])
                                                                            (auStack_12980 +
                                                                            uVar67 * 8));
                                          auVar91 = vmulpd_avx512f(auVar85,*(undefined1 (*) [64])
                                                                            (auStack_12780 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar86,*(undefined1 (*) [64])
                                                                            (auStack_12540 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar87,*(undefined1 (*) [64])
                                                                            (auStack_11f00 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar88,*(undefined1 (*) [64])
                                                                            (auStack_12100 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar89,*(undefined1 (*) [64])
                                                                            (auStack_12300 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          *(undefined1 (*) [64])(local_e0c0 + uVar67 * 8) = auVar90;
                                          uVar67 = uVar67 + 8;
                                        } while (uVar67 < 0x38);
                                        auVar39._8_8_ = 0;
                                        auVar39._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x1e];
                                        auVar84 = vbroadcastsd_avx512f(auVar39);
                                        auVar40._8_8_ = 0;
                                        auVar40._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x1f];
                                        auVar85 = vbroadcastsd_avx512f(auVar40);
                                        auVar41._8_8_ = 0;
                                        auVar41._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x20];
                                        auVar86 = vbroadcastsd_avx512f(auVar41);
                                        auVar42._8_8_ = 0;
                                        auVar42._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x21];
                                        auVar87 = vbroadcastsd_avx512f(auVar42);
                                        auVar43._8_8_ = 0;
                                        auVar43._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x22];
                                        auVar88 = vbroadcastsd_avx512f(auVar43);
                                        auVar44._8_8_ = 0;
                                        auVar44._0_8_ =
                                             (peVar47->m_D).
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                             .m_storage.m_data.array[0x23];
                                        auVar89 = vbroadcastsd_avx512f(auVar44);
                                        uVar67 = 0xfffffffffffffff8;
                                        do {
                                          auVar90 = vmulpd_avx512f(auVar84,*(undefined1 (*) [64])
                                                                            (auStack_12980 +
                                                                            uVar67 * 8));
                                          auVar91 = vmulpd_avx512f(auVar85,*(undefined1 (*) [64])
                                                                            (auStack_12780 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar86,*(undefined1 (*) [64])
                                                                            (auStack_12540 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar87,*(undefined1 (*) [64])
                                                                            (auStack_11f00 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar88,*(undefined1 (*) [64])
                                                                            (auStack_12100 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          auVar91 = vmulpd_avx512f(auVar89,*(undefined1 (*) [64])
                                                                            (auStack_12300 +
                                                                            uVar67 * 8));
                                          auVar90 = vaddpd_avx512f(auVar90,auVar91);
                                          *(undefined1 (*) [64])(local_e2c0 + uVar67 * 8) = auVar90;
                                          uVar67 = uVar67 + 8;
                                        } while (uVar67 < 0x38);
                                        lVar62 = (this->m_SD).
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                 .m_storage.m_cols;
                                        if (0x3f < lVar62) {
                                          pdVar81 = (this->m_SD).
                                                                                                        
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  .m_storage.m_data;
                                          lVar72 = (this->m_SD).
                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  .m_storage.m_rows;
                                          dStack_12380 = local_d900;
                                          uStack_12378 = uStack_d8f8;
                                          uStack_12370 = uStack_d8f0;
                                          uStack_12368 = uStack_d8e8;
                                          uStack_12360 = uStack_d8e0;
                                          uStack_12358 = uStack_d8d8;
                                          uStack_12350 = uStack_d8d0;
                                          uStack_12348 = uStack_d8c8;
                                          lStack_11d00 = local_d8c0;
                                          uStack_11cf8 = uStack_d8b8;
                                          uStack_11cf0 = uStack_d8b0;
                                          uStack_11ce8 = uStack_d8a8;
                                          uStack_11ce0 = uStack_d8a0;
                                          uStack_11cd8 = uStack_d898;
                                          uStack_11cd0 = uStack_d890;
                                          uStack_11cc8 = uStack_d888;
                                          lStack_11d40 = local_d880;
                                          uStack_11d38 = uStack_d878;
                                          uStack_11d30 = uStack_d870;
                                          uStack_11d28 = uStack_d868;
                                          uStack_11d20 = uStack_d860;
                                          uStack_11d18 = uStack_d858;
                                          uStack_11d10 = uStack_d850;
                                          uStack_11d08 = uStack_d848;
                                          local_f640 = local_d840;
                                          uStack_f638 = uStack_d838;
                                          uStack_f630 = uStack_d830;
                                          uStack_f628 = uStack_d828;
                                          uStack_f620 = uStack_d820;
                                          uStack_f618 = uStack_d818;
                                          uStack_f610 = uStack_d810;
                                          uStack_f608 = uStack_d808;
                                          local_f680 = local_d800;
                                          uStack_f678 = uStack_d7f8;
                                          uStack_f670 = uStack_d7f0;
                                          uStack_f668 = uStack_d7e8;
                                          uStack_f660 = uStack_d7e0;
                                          uStack_f658 = uStack_d7d8;
                                          uStack_f650 = uStack_d7d0;
                                          uStack_f648 = uStack_d7c8;
                                          local_f6c0 = local_d7c0;
                                          uStack_f6b8 = uStack_d7b8;
                                          uStack_f6b0 = uStack_d7b0;
                                          uStack_f6a8 = uStack_d7a8;
                                          uStack_f6a0 = uStack_d7a0;
                                          uStack_f698 = uStack_d798;
                                          uStack_f690 = uStack_d790;
                                          uStack_f688 = uStack_d788;
                                          local_f700 = local_d780;
                                          uStack_f6f8 = uStack_d778;
                                          uStack_f6f0 = uStack_d770;
                                          uStack_f6e8 = uStack_d768;
                                          uStack_f6e0 = uStack_d760;
                                          uStack_f6d8 = uStack_d758;
                                          uStack_f6d0 = uStack_d750;
                                          uStack_f6c8 = uStack_d748;
                                          local_f740 = local_d740;
                                          uStack_f738 = uStack_d738;
                                          uStack_f730 = uStack_d730;
                                          uStack_f728 = uStack_d728;
                                          uStack_f720 = uStack_d720;
                                          uStack_f718 = uStack_d718;
                                          uStack_f710 = uStack_d710;
                                          uStack_f708 = uStack_d708;
                                          local_f780 = local_db00;
                                          uStack_f778 = uStack_daf8;
                                          uStack_f770 = uStack_daf0;
                                          uStack_f768 = uStack_dae8;
                                          uStack_f760 = uStack_dae0;
                                          uStack_f758 = uStack_dad8;
                                          uStack_f750 = uStack_dad0;
                                          uStack_f748 = uStack_dac8;
                                          local_f7c0 = local_dac0;
                                          uStack_f7b8 = uStack_dab8;
                                          uStack_f7b0 = uStack_dab0;
                                          uStack_f7a8 = uStack_daa8;
                                          uStack_f7a0 = uStack_daa0;
                                          uStack_f798 = uStack_da98;
                                          uStack_f790 = uStack_da90;
                                          uStack_f788 = uStack_da88;
                                          local_f800 = local_da80;
                                          uStack_f7f8 = uStack_da78;
                                          uStack_f7f0 = uStack_da70;
                                          uStack_f7e8 = uStack_da68;
                                          uStack_f7e0 = uStack_da60;
                                          uStack_f7d8 = uStack_da58;
                                          uStack_f7d0 = uStack_da50;
                                          uStack_f7c8 = uStack_da48;
                                          local_f840 = local_da40;
                                          uStack_f838 = uStack_da38;
                                          uStack_f830 = uStack_da30;
                                          uStack_f828 = uStack_da28;
                                          uStack_f820 = uStack_da20;
                                          uStack_f818 = uStack_da18;
                                          uStack_f810 = uStack_da10;
                                          uStack_f808 = uStack_da08;
                                          uVar67 = (this->m_SD).
                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  .m_storage.m_rows;
                                          pauVar70 = (undefined1 (*) [64])(pdVar81 + 0xb8);
                                          lVar63 = lVar62 * 8;
                                          pauVar74 = (undefined1 (*) [64])local_c0c0;
                                          pauVar76 = (undefined1 (*) [64])(pdVar81 + 0xb8);
                                          pauVar64 = (undefined1 (*) [64])(pdVar81 + 0xb8);
                                          uVar78 = 0;
                                          local_f880 = local_da00;
                                          uStack_f878 = uStack_d9f8;
                                          uStack_f870 = uStack_d9f0;
                                          uStack_f868 = uStack_d9e8;
                                          uStack_f860 = uStack_d9e0;
                                          uStack_f858 = uStack_d9d8;
                                          uStack_f850 = uStack_d9d0;
                                          uStack_f848 = uStack_d9c8;
                                          local_f8c0 = local_d9c0;
                                          uStack_f8b8 = uStack_d9b8;
                                          uStack_f8b0 = uStack_d9b0;
                                          uStack_f8a8 = uStack_d9a8;
                                          uStack_f8a0 = uStack_d9a0;
                                          uStack_f898 = uStack_d998;
                                          uStack_f890 = uStack_d990;
                                          uStack_f888 = uStack_d988;
                                          local_e340 = local_d980;
                                          uStack_e338 = uStack_d978;
                                          uStack_e330 = uStack_d970;
                                          uStack_e328 = uStack_d968;
                                          uStack_e320 = uStack_d960;
                                          uStack_e318 = uStack_d958;
                                          uStack_e310 = uStack_d950;
                                          uStack_e308 = uStack_d948;
                                          local_e380 = local_d940;
                                          uStack_e378 = uStack_d938;
                                          uStack_e370 = uStack_d930;
                                          uStack_e368 = uStack_d928;
                                          uStack_e360 = uStack_d920;
                                          uStack_e358 = uStack_d918;
                                          uStack_e350 = uStack_d910;
                                          uStack_e348 = uStack_d908;
                                          local_e3c0 = local_dd00;
                                          uStack_e3b8 = uStack_dcf8;
                                          uStack_e3b0 = uStack_dcf0;
                                          uStack_e3a8 = uStack_dce8;
                                          uStack_e3a0 = uStack_dce0;
                                          uStack_e398 = uStack_dcd8;
                                          uStack_e390 = uStack_dcd0;
                                          uStack_e388 = uStack_dcc8;
                                          local_e400 = local_dcc0;
                                          uStack_e3f8 = uStack_dcb8;
                                          uStack_e3f0 = uStack_dcb0;
                                          uStack_e3e8 = uStack_dca8;
                                          uStack_e3e0 = uStack_dca0;
                                          uStack_e3d8 = uStack_dc98;
                                          uStack_e3d0 = uStack_dc90;
                                          uStack_e3c8 = uStack_dc88;
                                          while ((((~((long)uVar67 >> 0x3f) & uVar67) != uVar78 &&
                                                  (0x7f < lVar62)) && (0xbf < lVar62))) {
                                            auVar87._8_8_ = uStack_d8f8;
                                            auVar87._0_8_ = local_d900;
                                            auVar87._16_8_ = uStack_d8f0;
                                            auVar87._24_8_ = uStack_d8e8;
                                            auVar87._32_8_ = uStack_d8e0;
                                            auVar87._40_8_ = uStack_d8d8;
                                            auVar87._48_8_ = uStack_d8d0;
                                            auVar87._56_8_ = uStack_d8c8;
                                            auVar84 = vmulpd_avx512f(auVar87,pauVar70[-0x17]);
                                            auVar85 = vmulpd_avx512f(local_e300,pauVar70[-0xf]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_e100,pauVar70[-7]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-0x17] = auVar84;
                                            auVar89._8_8_ = uStack_d8b8;
                                            auVar89._0_8_ = local_d8c0;
                                            auVar89._16_8_ = uStack_d8b0;
                                            auVar89._24_8_ = uStack_d8a8;
                                            auVar89._32_8_ = uStack_d8a0;
                                            auVar89._40_8_ = uStack_d898;
                                            auVar89._48_8_ = uStack_d890;
                                            auVar89._56_8_ = uStack_d888;
                                            auVar84 = vmulpd_avx512f(auVar89,pauVar70[-0x16]);
                                            auVar85 = vmulpd_avx512f(local_e2c0,pauVar70[-0xe]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_e0c0,pauVar70[-6]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-0x16] = auVar84;
                                            auVar88._8_8_ = uStack_d878;
                                            auVar88._0_8_ = local_d880;
                                            auVar88._16_8_ = uStack_d870;
                                            auVar88._24_8_ = uStack_d868;
                                            auVar88._32_8_ = uStack_d860;
                                            auVar88._40_8_ = uStack_d858;
                                            auVar88._48_8_ = uStack_d850;
                                            auVar88._56_8_ = uStack_d848;
                                            auVar84 = vmulpd_avx512f(auVar88,pauVar70[-0x15]);
                                            auVar85 = vmulpd_avx512f(local_e280,pauVar70[-0xd]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_e080,pauVar70[-5]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-0x15] = auVar84;
                                            auVar94._8_8_ = uStack_d838;
                                            auVar94._0_8_ = local_d840;
                                            auVar94._16_8_ = uStack_d830;
                                            auVar94._24_8_ = uStack_d828;
                                            auVar94._32_8_ = uStack_d820;
                                            auVar94._40_8_ = uStack_d818;
                                            auVar94._48_8_ = uStack_d810;
                                            auVar94._56_8_ = uStack_d808;
                                            auVar84 = vmulpd_avx512f(auVar94,pauVar70[-0x14]);
                                            auVar85 = vmulpd_avx512f(local_e240,pauVar70[-0xc]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_e040,pauVar70[-4]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-0x14] = auVar84;
                                            auVar93._8_8_ = uStack_d7f8;
                                            auVar93._0_8_ = local_d800;
                                            auVar93._16_8_ = uStack_d7f0;
                                            auVar93._24_8_ = uStack_d7e8;
                                            auVar93._32_8_ = uStack_d7e0;
                                            auVar93._40_8_ = uStack_d7d8;
                                            auVar93._48_8_ = uStack_d7d0;
                                            auVar93._56_8_ = uStack_d7c8;
                                            auVar84 = vmulpd_avx512f(auVar93,pauVar70[-0x13]);
                                            auVar85 = vmulpd_avx512f(local_e200,pauVar70[-0xb]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_e000,pauVar70[-3]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-0x13] = auVar84;
                                            auVar92._8_8_ = uStack_d7b8;
                                            auVar92._0_8_ = local_d7c0;
                                            auVar92._16_8_ = uStack_d7b0;
                                            auVar92._24_8_ = uStack_d7a8;
                                            auVar92._32_8_ = uStack_d7a0;
                                            auVar92._40_8_ = uStack_d798;
                                            auVar92._48_8_ = uStack_d790;
                                            auVar92._56_8_ = uStack_d788;
                                            auVar84 = vmulpd_avx512f(auVar92,pauVar70[-0x12]);
                                            auVar85 = vmulpd_avx512f(local_e1c0,pauVar70[-10]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_dfc0,pauVar70[-2]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-0x12] = auVar84;
                                            auVar91._8_8_ = uStack_d778;
                                            auVar91._0_8_ = local_d780;
                                            auVar91._16_8_ = uStack_d770;
                                            auVar91._24_8_ = uStack_d768;
                                            auVar91._32_8_ = uStack_d760;
                                            auVar91._40_8_ = uStack_d758;
                                            auVar91._48_8_ = uStack_d750;
                                            auVar91._56_8_ = uStack_d748;
                                            auVar84 = vmulpd_avx512f(auVar91,pauVar70[-0x11]);
                                            auVar85 = vmulpd_avx512f(local_e180,pauVar70[-9]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_df80,pauVar70[-1]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-0x11] = auVar84;
                                            auVar90._8_8_ = uStack_d738;
                                            auVar90._0_8_ = local_d740;
                                            auVar90._16_8_ = uStack_d730;
                                            auVar90._24_8_ = uStack_d728;
                                            auVar90._32_8_ = uStack_d720;
                                            auVar90._40_8_ = uStack_d718;
                                            auVar90._48_8_ = uStack_d710;
                                            auVar90._56_8_ = uStack_d708;
                                            auVar84 = vmulpd_avx512f(auVar90,pauVar70[-0x10]);
                                            auVar85 = vmulpd_avx512f(local_e140,pauVar70[-8]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_df40,*pauVar70);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-0x10] = auVar84;
                                            if (((lVar72 <= (long)uVar78) || (lVar62 < 0x40)) ||
                                               ((lVar62 < 0x80 || (lVar62 < 0xc0)))) break;
                                            auVar84 = vmulpd_avx512f(local_e300,pauVar76[-0x17]);
                                            auVar57._8_8_ = uStack_daf8;
                                            auVar57._0_8_ = local_db00;
                                            auVar57._16_8_ = uStack_daf0;
                                            auVar57._24_8_ = uStack_dae8;
                                            auVar57._32_8_ = uStack_dae0;
                                            auVar57._40_8_ = uStack_dad8;
                                            auVar57._48_8_ = uStack_dad0;
                                            auVar57._56_8_ = uStack_dac8;
                                            auVar85 = vmulpd_avx512f(auVar57,pauVar76[-0xf]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_df00,pauVar76[-7]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-0xf] = auVar84;
                                            auVar84 = vmulpd_avx512f(local_e2c0,pauVar76[-0x16]);
                                            auVar56._8_8_ = uStack_dab8;
                                            auVar56._0_8_ = local_dac0;
                                            auVar56._16_8_ = uStack_dab0;
                                            auVar56._24_8_ = uStack_daa8;
                                            auVar56._32_8_ = uStack_daa0;
                                            auVar56._40_8_ = uStack_da98;
                                            auVar56._48_8_ = uStack_da90;
                                            auVar56._56_8_ = uStack_da88;
                                            auVar85 = vmulpd_avx512f(auVar56,pauVar76[-0xe]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_dec0,pauVar76[-6]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-0xe] = auVar84;
                                            auVar84 = vmulpd_avx512f(local_e280,pauVar76[-0x15]);
                                            auVar55._8_8_ = uStack_da78;
                                            auVar55._0_8_ = local_da80;
                                            auVar55._16_8_ = uStack_da70;
                                            auVar55._24_8_ = uStack_da68;
                                            auVar55._32_8_ = uStack_da60;
                                            auVar55._40_8_ = uStack_da58;
                                            auVar55._48_8_ = uStack_da50;
                                            auVar55._56_8_ = uStack_da48;
                                            auVar85 = vmulpd_avx512f(auVar55,pauVar76[-0xd]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_de80,pauVar76[-5]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-0xd] = auVar84;
                                            auVar84 = vmulpd_avx512f(local_e240,pauVar76[-0x14]);
                                            auVar54._8_8_ = uStack_da38;
                                            auVar54._0_8_ = local_da40;
                                            auVar54._16_8_ = uStack_da30;
                                            auVar54._24_8_ = uStack_da28;
                                            auVar54._32_8_ = uStack_da20;
                                            auVar54._40_8_ = uStack_da18;
                                            auVar54._48_8_ = uStack_da10;
                                            auVar54._56_8_ = uStack_da08;
                                            auVar85 = vmulpd_avx512f(auVar54,pauVar76[-0xc]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_de40,pauVar76[-4]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-0xc] = auVar84;
                                            auVar84 = vmulpd_avx512f(local_e200,pauVar76[-0x13]);
                                            auVar53._8_8_ = uStack_d9f8;
                                            auVar53._0_8_ = local_da00;
                                            auVar53._16_8_ = uStack_d9f0;
                                            auVar53._24_8_ = uStack_d9e8;
                                            auVar53._32_8_ = uStack_d9e0;
                                            auVar53._40_8_ = uStack_d9d8;
                                            auVar53._48_8_ = uStack_d9d0;
                                            auVar53._56_8_ = uStack_d9c8;
                                            auVar85 = vmulpd_avx512f(auVar53,pauVar76[-0xb]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_de00,pauVar76[-3]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-0xb] = auVar84;
                                            auVar84 = vmulpd_avx512f(local_e1c0,pauVar76[-0x12]);
                                            auVar95._8_8_ = uStack_d9b8;
                                            auVar95._0_8_ = local_d9c0;
                                            auVar95._16_8_ = uStack_d9b0;
                                            auVar95._24_8_ = uStack_d9a8;
                                            auVar95._32_8_ = uStack_d9a0;
                                            auVar95._40_8_ = uStack_d998;
                                            auVar95._48_8_ = uStack_d990;
                                            auVar95._56_8_ = uStack_d988;
                                            auVar85 = vmulpd_avx512f(auVar95,pauVar76[-10]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_ddc0,pauVar76[-2]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-10] = auVar84;
                                            auVar84 = vmulpd_avx512f(local_e180,pauVar76[-0x11]);
                                            auVar61._8_8_ = uStack_d978;
                                            auVar61._0_8_ = local_d980;
                                            auVar61._16_8_ = uStack_d970;
                                            auVar61._24_8_ = uStack_d968;
                                            auVar61._32_8_ = uStack_d960;
                                            auVar61._40_8_ = uStack_d958;
                                            auVar61._48_8_ = uStack_d950;
                                            auVar61._56_8_ = uStack_d948;
                                            auVar85 = vmulpd_avx512f(auVar61,pauVar76[-9]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_dd80,pauVar76[-1]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-9] = auVar84;
                                            auVar84 = vmulpd_avx512f(local_e140,pauVar76[-0x10]);
                                            auVar60._8_8_ = uStack_d938;
                                            auVar60._0_8_ = local_d940;
                                            auVar60._16_8_ = uStack_d930;
                                            auVar60._24_8_ = uStack_d928;
                                            auVar60._32_8_ = uStack_d920;
                                            auVar60._40_8_ = uStack_d918;
                                            auVar60._48_8_ = uStack_d910;
                                            auVar60._56_8_ = uStack_d908;
                                            auVar85 = vmulpd_avx512f(auVar60,pauVar76[-8]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_dd40,*pauVar76);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-8] = auVar84;
                                            if (((lVar72 <= (long)uVar78) || (lVar62 < 0x40)) ||
                                               ((lVar62 < 0x80 || (lVar62 < 0xc0)))) break;
                                            auVar84 = vmulpd_avx512f(local_e100,pauVar64[-0x17]);
                                            auVar85 = vmulpd_avx512f(local_df00,pauVar64[-0xf]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar59._8_8_ = uStack_dcf8;
                                            auVar59._0_8_ = local_dd00;
                                            auVar59._16_8_ = uStack_dcf0;
                                            auVar59._24_8_ = uStack_dce8;
                                            auVar59._32_8_ = uStack_dce0;
                                            auVar59._40_8_ = uStack_dcd8;
                                            auVar59._48_8_ = uStack_dcd0;
                                            auVar59._56_8_ = uStack_dcc8;
                                            auVar85 = vmulpd_avx512f(auVar59,pauVar64[-7]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-7] = auVar84;
                                            auVar84 = vmulpd_avx512f(local_e0c0,pauVar64[-0x16]);
                                            auVar85 = vmulpd_avx512f(local_dec0,pauVar64[-0xe]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar58._8_8_ = uStack_dcb8;
                                            auVar58._0_8_ = local_dcc0;
                                            auVar58._16_8_ = uStack_dcb0;
                                            auVar58._24_8_ = uStack_dca8;
                                            auVar58._32_8_ = uStack_dca0;
                                            auVar58._40_8_ = uStack_dc98;
                                            auVar58._48_8_ = uStack_dc90;
                                            auVar58._56_8_ = uStack_dc88;
                                            auVar85 = vmulpd_avx512f(auVar58,pauVar64[-6]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-6] = auVar84;
                                            auVar84 = vmulpd_avx512f(local_e080,pauVar64[-0x15]);
                                            auVar85 = vmulpd_avx512f(local_de80,pauVar64[-0xd]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_dc80,pauVar64[-5]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-5] = auVar84;
                                            auVar84 = vmulpd_avx512f(local_e040,pauVar64[-0x14]);
                                            auVar85 = vmulpd_avx512f(local_de40,pauVar64[-0xc]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_dc40,pauVar64[-4]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-4] = auVar84;
                                            auVar84 = vmulpd_avx512f(local_e000,pauVar64[-0x13]);
                                            auVar85 = vmulpd_avx512f(local_de00,pauVar64[-0xb]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_dc00,pauVar64[-3]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-3] = auVar84;
                                            auVar84 = vmulpd_avx512f(local_dfc0,pauVar64[-0x12]);
                                            auVar85 = vmulpd_avx512f(local_ddc0,pauVar64[-10]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_dbc0,pauVar64[-2]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-2] = auVar84;
                                            auVar84 = vmulpd_avx512f(local_df80,pauVar64[-0x11]);
                                            auVar85 = vmulpd_avx512f(local_dd80,pauVar64[-9]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_db80,pauVar64[-1]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            pauVar74[-1] = auVar84;
                                            auVar84 = vmulpd_avx512f(local_df40,pauVar64[-0x10]);
                                            auVar85 = vmulpd_avx512f(local_dd40,pauVar64[-8]);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            auVar85 = vmulpd_avx512f(local_db40,*pauVar64);
                                            auVar84 = vaddpd_avx512f(auVar84,auVar85);
                                            *pauVar74 = auVar84;
                                            uVar78 = uVar78 + 1;
                                            pauVar70 = (undefined1 (*) [64])(*pauVar70 + lVar63);
                                            pauVar74 = pauVar74 + 0x18;
                                            pauVar76 = (undefined1 (*) [64])(*pauVar76 + lVar63);
                                            pauVar64 = (undefined1 (*) [64])(*pauVar64 + lVar63);
                                            if (uVar78 == 0x20) {
                                              auVar45._8_8_ = 0;
                                              auVar45._0_8_ = dStack_125a0;
                                              auVar84 = vbroadcastsd_avx512f(auVar45);
                                              uVar67 = 0xfffffffffffffff8;
                                              do {
                                                auVar85 = vmulpd_avx512f(auVar84,*(undefined1
                                                                                   (*) [64])
                                                                                  ((this->
                                                  m_MassMatrix).
                                                  super_PlainObjectBase<Eigen::Matrix<double,_528,_1,_0,_528,_1>_>
                                                  .m_storage.m_data.array + uVar67 + 8));
                                                *(undefined1 (*) [64])(auStack_d6c0 + uVar67 * 8) =
                                                     auVar85;
                                                uVar67 = uVar67 + 8;
                                              } while (uVar67 < 0x208);
                                              pdVar81 = (this->m_SD).
                                                                                                                
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  .m_storage.m_data;
                                              local_f7c0 = this;
                                              lVar62 = (this->m_SD).
                                                                                                              
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  .m_storage.m_cols;
                                              if (pdVar81 != (double *)0x0 && lVar62 < 0) {
                                                __assert_fail(
                                                  "(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                                                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",
                                                  0xb2,
                                                  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, Level = 0]"
                                                  );
                                              }
                                              auVar46._8_8_ = 0;
                                              auVar46._0_8_ = dStack_12bd0;
                                              auVar84 = vbroadcastsd_avx512f(auVar46);
                                              pdVar79 = local_c5c0;
                                              pdVar68 = pdVar81 + 0x18;
                                              local_f8c0 = lVar62 * 8;
                                              lVar72 = 0x20;
                                              lVar63 = 0;
                                              uVar67 = 0;
                                              do {
                                                local_f640 = lVar62 * lVar63;
                                                dStack_12380 = (double)(lVar63 * 3);
                                                pdVar69 = (pCVar82->
                                                                                                                    
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_data;
                                                lVar71 = (pCVar82->
                                                                                                                  
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_rows.m_value;
                                                local_f800 = (pCVar82->
                                                                                                                          
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).m_stride.m_outer.m_value;
                                                local_f6c0 = pdVar69 + local_f800 *
                                                                       (long)dStack_12380;
                                                lStack_11d00 = lVar63 * 3 + 1;
                                                local_f700 = pdVar69 + local_f800 * lStack_11d00;
                                                lStack_11d40 = lVar63 * 3 + 2;
                                                local_f740 = pdVar69 + local_f800 * lStack_11d40;
                                                uVar67 = uVar67 & 0xffffffff;
                                                local_f680 = 0x210;
                                                if (0x210 < uVar67) {
                                                  local_f680 = uVar67;
                                                }
                                                local_f880 = lVar72;
                                                local_f780 = lVar72 + uVar67;
                                                local_f840 = pdVar79;
                                                lVar66 = lVar63;
                                                pdVar80 = pdVar79;
                                                do {
                                                  if ((this->m_SD).
                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  .m_storage.m_rows <= lVar63) {
                                                    __assert_fail(
                                                  "(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                                                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a
                                                  ,
                                                  "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = -1, InnerPanel = true]"
                                                  );
                                                  }
                                                  if (lVar62 < 0) {
                                                    __assert_fail(
                                                  "rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                                                  ,
                                                  "/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h"
                                                  ,0x4a,
                                                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, 1, -1>]"
                                                  );
                                                  }
                                                  if (lVar62 != 0xc0) {
                                                    pcVar65 = 
                                                  "Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, 32, 192, 1>, 1, 192, true>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Rhs = Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, 32, 192, 1>, 1, 192, true>>, Option = 0]"
                                                  ;
                                                  goto LAB_0070d12b;
                                                  }
                                                  puStack_12590 = auStack_12588;
                                                  auVar85 = vmulpd_avx512f(auVar84,*(undefined1
                                                                                     (*) [64])
                                                                                    (pdVar81 +
                                                                                    local_f640));
                                                  auVar85 = vmulpd_avx512f(auVar85,*(undefined1
                                                                                     (*) [64])
                                                                                    (&local_c680 +
                                                                                    lVar66 * 0xc0));
                                                  auVar86 = vmulpd_avx512f(auVar84,*(undefined1
                                                                                     (*) [64])
                                                                                    (pdVar81 +
                                                                                    local_f640 + 8))
                                                  ;
                                                  auVar86 = vmulpd_avx512f(auVar86,*(undefined1
                                                                                     (*) [64])
                                                                                    (local_c640 +
                                                                                    lVar66 * 0xc0));
                                                  uVar78 = 0xfffffffffffffff0;
                                                  do {
                                                    auVar87 = vmulpd_avx512f(auVar84,*(undefined1
                                                                                       (*) [64])
                                                                                      (pdVar68 +
                                                                                      uVar78 + 8));
                                                    auVar87 = vmulpd_avx512f(auVar87,*(undefined1
                                                                                       (*) [64])
                                                                                      (pdVar80 +
                                                                                      uVar78 + 8));
                                                    auVar85 = vaddpd_avx512f(auVar85,auVar87);
                                                    auVar87 = vmulpd_avx512f(auVar84,*(undefined1
                                                                                       (*) [64])
                                                                                      (pdVar68 +
                                                                                      uVar78 + 0x10)
                                                                            );
                                                    auVar87 = vmulpd_avx512f(auVar87,*(undefined1
                                                                                       (*) [64])
                                                                                      (pdVar80 +
                                                                                      uVar78 + 0x10)
                                                                            );
                                                    auVar86 = vaddpd_avx512f(auVar86,auVar87);
                                                    uVar78 = uVar78 + 0x10;
                                                  } while (uVar78 < 0xa0);
                                                  if (uVar67 == local_f680) {
                                                    __assert_fail("index >= 0 && index < size()",
                                                                                                                                    
                                                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h"
                                                  ,0x1ab,
                                                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 528, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 528, 1>, Level = 1]"
                                                  );
                                                  }
                                                  if ((lVar71 <= (long)dStack_12380) ||
                                                     (lVar51 = lVar66 * 3,
                                                     (pCVar82->
                                                                                                          
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value <= lVar51)) {
LAB_0070d0d2:
                                                    __assert_fail(
                                                  "row >= 0 && row < rows() && col >= 0 && col < cols()"
                                                  ,
                                                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h"
                                                  ,0x16f,
                                                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                                                  );
                                                  }
                                                  auVar85 = vaddpd_avx512f(auVar85,auVar86);
                                                  auVar83 = vextractf64x4_avx512f(auVar85,1);
                                                  dVar49 = auVar85._0_8_ + auVar83._0_8_ +
                                                           auVar85._8_8_ + auVar83._8_8_ +
                                                           auVar85._16_8_ + auVar83._16_8_ +
                                                           auVar85._24_8_ + auVar83._24_8_ +
                                                           *(double *)(local_d700 + uVar67 * 8);
                                                  local_f6c0[lVar66 * 3] =
                                                       dVar49 + local_f6c0[lVar66 * 3];
                                                  if ((lVar71 <= lStack_11d00) ||
                                                     (((lVar1 = lVar51 + 1,
                                                       (pCVar82->
                                                                                                              
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value <= lVar1 ||
                                                  (local_f700[lVar66 * 3 + 1] =
                                                        dVar49 + local_f700[lVar66 * 3 + 1],
                                                  lVar71 <= lStack_11d40)) ||
                                                  (lVar2 = lVar51 + 2,
                                                  (pCStack_12bf8->
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value <= lVar2)))) goto LAB_0070d0d2;
                                                  local_f740[lVar66 * 3 + 2] =
                                                       dVar49 + local_f740[lVar66 * 3 + 2];
                                                  if (lVar63 != lVar66) {
                                                    if ((((lVar71 <= lVar51) ||
                                                         ((pCStack_12bf8->
                                                                                                                    
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value <= (long)dStack_12380)) ||
                                                  ((pdVar69[lVar63 * 3 + lVar51 * local_f800] =
                                                         dVar49 + pdVar69[lVar63 * 3 +
                                                                          lVar51 * local_f800],
                                                   lVar71 <= lVar1 ||
                                                   (((pCStack_12bf8->
                                                                                                          
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value <= lStack_11d00 ||
                                                  (pdVar69[lVar63 * 3 + lVar1 * local_f800 + 1] =
                                                        dVar49 + pdVar69[lVar63 * 3 +
                                                                         lVar1 * local_f800 + 1],
                                                  lVar71 <= lVar2)))))) ||
                                                  ((pCStack_12bf8->
                                                                                                      
                                                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                                  ).
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                                  .m_cols.m_value <= lStack_11d40))
                                                  goto LAB_0070d0d2;
                                                  pdVar69[lVar63 * 3 + lVar2 * local_f800 + 2] =
                                                       dVar49 + pdVar69[lVar63 * 3 +
                                                                        lVar2 * local_f800 + 2];
                                                  }
                                                  uVar67 = uVar67 + 1;
                                                  lVar66 = lVar66 + 1;
                                                  pdVar80 = pdVar80 + 0xc0;
                                                  pCVar82 = pCStack_12bf8;
                                                } while (uVar67 != local_f780);
                                                lVar63 = lVar63 + 1;
                                                lVar72 = lVar72 + -1;
                                                pdVar79 = pdVar79 + 0xc0;
                                                pdVar68 = pdVar68 + 0xc0;
                                                if (lVar63 == 0x20) {
                                                  if ((DenseStorage<double,__1,__1,__1,_1> *)
                                                      DStack_12c10.m_data !=
                                                      (DenseStorage<double,__1,__1,__1,_1> *)0x0) {
                                                    free((void *)((
                                                  DenseStorage<double,__1,__1,__1,_1> *)
                                                  ((long)DStack_12c10.m_data + -0x18))->m_cols);
                                                  }
                                                  if (DStack_12c30.m_data != (double *)0x0) {
                                                    free((void *)DStack_12c30.m_data[-1]);
                                                  }
                                                  if (DStack_12bf0.m_data != (double *)0x0) {
                                                    free((void *)DStack_12bf0.m_data[-1]);
                                                  }
                                                  return;
                                                }
                                              } while( true );
                                            }
                                          }
                                        }
LAB_0070d0f4:
                                        pcVar65 = 
                                        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, 64>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = 64, InnerPanel = false]"
                                        ;
                                        goto LAB_0070d109;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            pcVar65 = 
                            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 64, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
                            ;
                            goto LAB_0070d1cd;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    pcVar65 = 
    "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 96, 64>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 96, BlockCols = 64, InnerPanel = false]"
    ;
LAB_0070d109:
    __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,pcVar65);
  }
  pcVar65 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double, 192, 3, 0>, 64, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
  ;
LAB_0070d1cd:
  __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar65);
}

Assistant:

void ChElementHexaANCF_3843::ComputeInternalJacobianContIntDamping(ChMatrixRef& H,
                                                                   double Kfactor,
                                                                   double Rfactor,
                                                                   double Mfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Continuous Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // Jacobian of the generalized internal force vector is integrated across the volume of the element every time this
    // calculation is performed. For this element, this is likely more efficient than the "Pre-Integration" style
    // calculation method.

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    // No values from the generalized internal force vector are cached for reuse in the Jacobian.  Instead these
    // quantities are recalculated again during the Jacobian calculations.  This both simplifies the code and speeds
    // up the generalized internal force calculation while only having a minimal impact on the performance of the
    // Jacobian calculation speed.  The Jacobian calculation is performed in two major pieces.  First is the
    // calculation of the potentially non-symmetric and non-sparse component.  The second pieces is the symmetric
    // and sparse component.

    // =============================================================================
    // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
    // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
    // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31  F11dot  F21dot  F31dot ]
    // FC = [F12  F22  F32  F12dot  F22dot  F32dot ]
    //      [F13  F23  F33  F13dot  F23dot  F33dot ]
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.transpose() * ebar_ebardot;

    //==============================================================================
    //==============================================================================
    // Calculate the potentially non-symmetric and non-sparse component of the Jacobian matrix
    //==============================================================================
    //==============================================================================

    // =============================================================================
    // Calculate the partial derivative of the Green-Largrange strains with respect to the nodal coordinates
    // (transposed).  This calculation is performed in blocks across all the Gauss quadrature points at the same
    // time.  This value should be store in row major memory layout to align with the access patterns for
    // calculating this matrix.
    // PE = [(d epsilon1/d e)GQPnt1' (d epsilon1/d e)GQPnt2' ... (d epsilon1/d e)GQPntNIP'...
    //       (d epsilon2/d e)GQPnt1' (d epsilon2/d e)GQPnt2' ... (d epsilon2/d e)GQPntNIP'...
    //       (d epsilon3/d e)GQPnt1' (d epsilon3/d e)GQPnt2' ... (d epsilon3/d e)GQPntNIP'...
    //       (d epsilon4/d e)GQPnt1' (d epsilon4/d e)GQPnt2' ... (d epsilon4/d e)GQPntNIP'...
    //       (d epsilon5/d e)GQPnt1' (d epsilon5/d e)GQPnt2' ... (d epsilon5/d e)GQPntNIP'...
    //       (d epsilon6/d e)GQPnt1' (d epsilon6/d e)GQPnt2' ... (d epsilon6/d e)GQPntNIP']
    // Note that each partial derivative block shown is placed to the left of the previous block.
    // The explanation of the calculation above is just too long to write it all on a single line.
    // =============================================================================

    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> PE;
    PE.resize(3 * NSF, 6 * NIP);

    for (auto i = 0; i < NSF; i++) {
        PE.block<1, NIP>(3 * i, 0 * NIP) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose());
        PE.block<1, NIP>(3 * i, 1 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());
        PE.block<1, NIP>(3 * i, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
        PE.block<1, NIP>(3 * i, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
        PE.block<1, NIP>(3 * i, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
        PE.block<1, NIP>(3 * i, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());

        PE.block<1, NIP>((3 * i) + 1, 0) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose());
        PE.block<1, NIP>((3 * i) + 1, NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());
        PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
        PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
        PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
        PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());

        PE.block<1, NIP>((3 * i) + 2, 0) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose());
        PE.block<1, NIP>((3 * i) + 2, NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
        PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
        PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
        PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
        PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
    }

    // =============================================================================
    // Combine the deformation gradient, time derivative of the deformation gradient, damping coefficient, Gauss
    // quadrature weighting times the element Jacobian, and Jacobian component scale factors into a scaled block
    // deformation gradient matrix Calculate the deformation gradient and time derivative of the deformation
    // gradient for all Gauss quadrature points in a single matrix multiplication.  Note that the resulting combined
    // deformation gradient block matrix will be ordered by block matrix (column vectors) components Note that the
    // indices of the components are in transposed order
    //            [kGQ*(Kfactor+alpha*Rfactor)*F11+alpha*Rfactor*F11dot ... similar for F21 & F31 blocks]
    // FCscaled = [kGQ*(Kfactor+alpha*Rfactor)*F12+alpha*Rfactor*F12dot ... similar for F22 & F32 blocks]
    //            [kGQ*(Kfactor+alpha*Rfactor)*F13+alpha*Rfactor*F13dot ... similar for F23 & F33 blocks]
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> FCscaled = (Kfactor + m_Alpha * Rfactor) * FC.template block<3 * NIP, 3>(0, 0) +
                                               (m_Alpha * Kfactor) * FC.template block<3 * NIP, 3>(0, 3);

    for (auto i = 0; i < 3; i++) {
        FCscaled.template block<NIP, 1>(0, i).array() *= m_kGQ.array();
        FCscaled.template block<NIP, 1>(NIP, i).array() *= m_kGQ.array();
        FCscaled.template block<NIP, 1>(2 * NIP, i).array() *= m_kGQ.array();
    }

    // =============================================================================
    // Calculate the combination of the scaled partial derivative of the Green-Largrange strains with respect to the
    // nodal coordinates, the scaled partial derivative of the time derivative of the Green-Largrange strains with
    // respect to the nodal coordinates, the scaled partial derivative of the Green-Largrange strains with respect
    // to the time derivative of the nodal coordinates, and the other parameters to correctly integrate across the
    // volume of the element.  This calculation is performed in blocks across all the Gauss quadrature points at the
    // same time.  This value should be store in row major memory layout to align with the access patterns for
    // calculating this matrix.
    // =============================================================================

    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> Scaled_Combined_PE;
    Scaled_Combined_PE.resize(3 * NSF, 6 * NIP);

    for (auto i = 0; i < NSF; i++) {
        Scaled_Combined_PE.block<1, NIP>(3 * i, 0) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose());
        Scaled_Combined_PE.block<1, NIP>(3 * i, NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());
        Scaled_Combined_PE.block<1, NIP>(3 * i, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
        Scaled_Combined_PE.block<1, NIP>(3 * i, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
        Scaled_Combined_PE.block<1, NIP>(3 * i, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
        Scaled_Combined_PE.block<1, NIP>(3 * i, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());

        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 0) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());

        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 0) =
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose()) +
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
            m_SD.block<1, NIP>(i, 2 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
        Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
            m_SD.block<1, NIP>(i, 1 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
            m_SD.block<1, NIP>(i, 0 * NIP).cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
    }

    // =============================================================================
    // Get the stiffness tensor in 6x6 matrix form
    // =============================================================================

    const ChMatrixNM<double, 6, 6>& D = GetMaterial()->Get_D();

    // =============================================================================
    // Multiply the scaled and combined partial derivative block matrix by the stiffness matrix for each individual
    // Gauss quadrature point
    // =============================================================================

    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> DScaled_Combined_PE;
    DScaled_Combined_PE.resize(3 * NSF, 6 * NIP);

    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 0) =
        D(0, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(0, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(0, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(0, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(0, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(0, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, NIP) =
        D(1, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(1, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(1, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(1, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(1, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(1, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 2 * NIP) =
        D(2, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(2, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(2, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(2, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(2, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(2, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 3 * NIP) =
        D(3, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(3, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(3, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(3, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(3, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(3, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 4 * NIP) =
        D(4, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(4, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(4, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(4, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(4, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(4, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
    DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 5 * NIP) =
        D(5, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
        D(5, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
        D(5, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
        D(5, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
        D(5, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
        D(5, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);

    // =============================================================================
    // Multiply the partial derivative block matrix by the final scaled and combined partial derivative block matrix
    // to obtain the potentially non-symmetric and non-sparse component of the Jacobian matrix
    // =============================================================================

    H = PE * DScaled_Combined_PE.transpose();

    //==============================================================================
    //==============================================================================
    // Calculate the sparse and symmetric component of the Jacobian matrix
    //==============================================================================
    //==============================================================================

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
    // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    // =============================================================================

    // Each entry in E1 = kGQ*(E11+alpha*E11dot)
    //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP E_BlockDamping = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                               FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                               FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5));
    VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
    E1_Block.array() -= 1;
    E1_Block *= 0.5;
    E1_Block += m_Alpha * E_BlockDamping;
    E1_Block.array() *= m_kGQ.array();

    // Each entry in E2 = kGQ*(E22+alpha*E22dot)
    //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                               FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                               FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
    VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                         FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                         FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
    E2_Block.array() -= 1;
    E2_Block *= 0.5;
    E2_Block += m_Alpha * E_BlockDamping;
    E2_Block.array() *= m_kGQ.array();

    // Each entry in E3 = kGQ*(E33+alpha*E33dot)
    //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping.noalias() =
        FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
        FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
        FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
    VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E3_Block.array() -= 1;
    E3_Block *= 0.5;
    E3_Block += m_Alpha * E_BlockDamping;
    E3_Block.array() *= m_kGQ.array();

    // Each entry in E4 = kGQ*(2*(E23+alpha*E23dot))
    //                  = kGQ*((F12*F13+F22*F23+F32*F33)
    //                    +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
    E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                               FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                               FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5)) +
                               FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                               FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                               FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
    VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E4_Block += m_Alpha * E_BlockDamping;
    E4_Block.array() *= m_kGQ.array();

    // Each entry in E5 = kGQ*(2*(E13+alpha*E13dot))
    //                  = kGQ*((F11*F13+F21*F23+F31*F33)
    //                    +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
    E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                               FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                               FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                               FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                               FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                               FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
    VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E5_Block += m_Alpha * E_BlockDamping;
    E5_Block.array() *= m_kGQ.array();

    // Each entry in E6 = kGQ*(2*(E12+alpha*E12dot))
    //                  = kGQ*((F11*F12+F21*F22+F31*F32)
    //                    +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
    E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                               FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                               FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                               FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                               FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                               FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
    VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
    E6_Block += m_Alpha * E_BlockDamping;
    E6_Block.array() *= m_kGQ.array();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points at a time
    // component by component. Note that the Green-Largrange strain components have been scaled and already been
    // combined with their scaled time derivatives and minus the Gauss quadrature weight times the element Jacobian at
    // the corresponding Gauss point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                             D(0, 4) * E5_Block + D(0, 5) * E6_Block;
    VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                             D(1, 4) * E5_Block + D(1, 5) * E6_Block;
    VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                             D(2, 4) * E5_Block + D(2, 5) * E6_Block;
    VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                             D(3, 4) * E5_Block + D(3, 5) * E6_Block;
    VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                             D(4, 4) * E5_Block + D(4, 5) * E6_Block;
    VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                             D(5, 4) * E5_Block + D(5, 5) * E6_Block;

    // =============================================================================
    // Multiply the shape function derivative matrix by the 2nd Piola-Kirchoff stresses for each corresponding Gauss
    // quadrature point
    // =============================================================================

    ChMatrixNM<double, NSF, 3 * NIP> S_scaled_SD;

    for (auto i = 0; i < NSF; i++) {
        S_scaled_SD.template block<1, NIP>(i, 0) =
            SPK2_1_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 0 * NIP)) +
            SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 1 * NIP)) +
            SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 2 * NIP));

        S_scaled_SD.template block<1, NIP>(i, NIP) =
            SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 0 * NIP)) +
            SPK2_2_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 1 * NIP)) +
            SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 2 * NIP));

        S_scaled_SD.template block<1, NIP>(i, 2 * NIP) =
            SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 0 * NIP)) +
            SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 1 * NIP)) +
            SPK2_3_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, 2 * NIP));
    }

    // =============================================================================
    // Calculate just the non-sparse upper triangular entires of the sparse and symmetric component of the Jacobian
    // matrix, combine this with the scaled mass matrix, and then expand them out to full size by summing the
    // contribution into the correct locations of the full sized Jacobian matrix
    // =============================================================================

    // Add in the Mass Matrix Which is Stored in Compact Upper Triangular Form
    ChVectorN<double, (NSF * (NSF + 1)) / 2> ScaledMassMatrix = Mfactor * m_MassMatrix;

    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            double d = Kfactor * m_SD.row(i) * S_scaled_SD.row(j).transpose();
            d += ScaledMassMatrix(idx);

            H(3 * i, 3 * j) += d;
            H(3 * i + 1, 3 * j + 1) += d;
            H(3 * i + 2, 3 * j + 2) += d;
            if (i != j) {
                H(3 * j, 3 * i) += d;
                H(3 * j + 1, 3 * i + 1) += d;
                H(3 * j + 2, 3 * i + 2) += d;
            }
            idx++;
        }
    }
}